

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  undefined4 uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  byte bVar76;
  ulong uVar77;
  ulong uVar78;
  byte bVar79;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  Primitive *pPVar80;
  uint uVar81;
  long lVar82;
  bool bVar83;
  ulong uVar84;
  uint uVar85;
  uint uVar138;
  uint uVar139;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar140;
  uint uVar144;
  undefined1 auVar131 [32];
  undefined1 auVar92 [16];
  undefined1 auVar132 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  float pp;
  float fVar145;
  float fVar146;
  undefined4 uVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar206;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar204;
  float fVar205;
  undefined1 auVar203 [64];
  float fVar207;
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar227;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar228 [64];
  float fVar232;
  float fVar233;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  undefined1 auVar231 [32];
  float fVar235;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [64];
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar240 [64];
  float fVar244;
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [16];
  float fVar249;
  undefined1 auVar248 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar254 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined8 local_900;
  undefined8 uStack_8f8;
  uint local_8e4;
  uint local_8e0;
  undefined4 local_8dc;
  float local_8d8;
  float local_8d4;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  Primitive *local_868;
  Primitive *local_860;
  ulong local_858;
  ulong local_850;
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  RTCHitN local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  uint local_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  uint uStack_580;
  uint uStack_57c;
  uint uStack_578;
  uint uStack_574;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar125 [32];
  undefined1 auVar133 [32];
  undefined1 auVar136 [32];
  
  PVar8 = prim[1];
  uVar78 = (ulong)(byte)PVar8;
  lVar82 = uVar78 * 0x19;
  fVar208 = *(float *)(prim + lVar82 + 0x12);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar245 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar91 = vinsertps_avx(auVar245,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar92 = vsubps_avx(auVar88,*(undefined1 (*) [16])(prim + lVar82 + 6));
  fVar207 = fVar208 * auVar92._0_4_;
  fVar145 = fVar208 * auVar91._0_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar88);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar245);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar99 = vpmovsxbd_avx2(auVar89);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar100 = vpmovsxbd_avx2(auVar6);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar105 = vpmovsxbd_avx2(auVar86);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar105);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar78 + 6);
  auVar97 = vpmovsxbd_avx2(auVar217);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar84 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar102 = vpmovsxbd_avx2(auVar7);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar84 + uVar78 + 6);
  auVar103 = vpmovsxbd_avx2(auVar87);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar77 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar95 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar95);
  auVar251 = ZEXT3264(auVar104);
  auVar115._4_4_ = fVar145;
  auVar115._0_4_ = fVar145;
  auVar115._8_4_ = fVar145;
  auVar115._12_4_ = fVar145;
  auVar115._16_4_ = fVar145;
  auVar115._20_4_ = fVar145;
  auVar115._24_4_ = fVar145;
  auVar115._28_4_ = fVar145;
  auVar201._8_4_ = 1;
  auVar201._0_8_ = 0x100000001;
  auVar201._12_4_ = 1;
  auVar201._16_4_ = 1;
  auVar201._20_4_ = 1;
  auVar201._24_4_ = 1;
  auVar201._28_4_ = 1;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar107 = ZEXT1632(CONCAT412(fVar208 * auVar91._12_4_,
                                CONCAT48(fVar208 * auVar91._8_4_,
                                         CONCAT44(fVar208 * auVar91._4_4_,fVar145))));
  auVar106 = vpermps_avx2(auVar201,auVar107);
  auVar94 = vpermps_avx512vl(auVar93,auVar107);
  fVar145 = auVar94._0_4_;
  fVar232 = auVar94._4_4_;
  auVar107._4_4_ = fVar232 * auVar99._4_4_;
  auVar107._0_4_ = fVar145 * auVar99._0_4_;
  fVar233 = auVar94._8_4_;
  auVar107._8_4_ = fVar233 * auVar99._8_4_;
  fVar234 = auVar94._12_4_;
  auVar107._12_4_ = fVar234 * auVar99._12_4_;
  fVar241 = auVar94._16_4_;
  auVar107._16_4_ = fVar241 * auVar99._16_4_;
  fVar242 = auVar94._20_4_;
  auVar107._20_4_ = fVar242 * auVar99._20_4_;
  fVar243 = auVar94._24_4_;
  auVar107._24_4_ = fVar243 * auVar99._24_4_;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar97._4_4_ * fVar232;
  auVar105._0_4_ = auVar97._0_4_ * fVar145;
  auVar105._8_4_ = auVar97._8_4_ * fVar233;
  auVar105._12_4_ = auVar97._12_4_ * fVar234;
  auVar105._16_4_ = auVar97._16_4_ * fVar241;
  auVar105._20_4_ = auVar97._20_4_ * fVar242;
  auVar105._24_4_ = auVar97._24_4_ * fVar243;
  auVar105._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar104._4_4_ * fVar232;
  auVar95._0_4_ = auVar104._0_4_ * fVar145;
  auVar95._8_4_ = auVar104._8_4_ * fVar233;
  auVar95._12_4_ = auVar104._12_4_ * fVar234;
  auVar95._16_4_ = auVar104._16_4_ * fVar241;
  auVar95._20_4_ = auVar104._20_4_ * fVar242;
  auVar95._24_4_ = auVar104._24_4_ * fVar243;
  auVar95._28_4_ = auVar94._28_4_;
  auVar88 = vfmadd231ps_fma(auVar107,auVar106,auVar96);
  auVar245 = vfmadd231ps_fma(auVar105,auVar106,auVar101);
  auVar89 = vfmadd231ps_fma(auVar95,auVar103,auVar106);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar115,auVar98);
  auVar245 = vfmadd231ps_fma(ZEXT1632(auVar245),auVar115,auVar100);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar102,auVar115);
  auVar116._4_4_ = fVar207;
  auVar116._0_4_ = fVar207;
  auVar116._8_4_ = fVar207;
  auVar116._12_4_ = fVar207;
  auVar116._16_4_ = fVar207;
  auVar116._20_4_ = fVar207;
  auVar116._24_4_ = fVar207;
  auVar116._28_4_ = fVar207;
  auVar255 = ZEXT3264(auVar116);
  auVar95 = ZEXT1632(CONCAT412(fVar208 * auVar92._12_4_,
                               CONCAT48(fVar208 * auVar92._8_4_,
                                        CONCAT44(fVar208 * auVar92._4_4_,fVar207))));
  auVar105 = vpermps_avx2(auVar201,auVar95);
  auVar95 = vpermps_avx512vl(auVar93,auVar95);
  fVar208 = auVar95._0_4_;
  fVar145 = auVar95._4_4_;
  auVar106._4_4_ = fVar145 * auVar99._4_4_;
  auVar106._0_4_ = fVar208 * auVar99._0_4_;
  fVar232 = auVar95._8_4_;
  auVar106._8_4_ = fVar232 * auVar99._8_4_;
  fVar233 = auVar95._12_4_;
  auVar106._12_4_ = fVar233 * auVar99._12_4_;
  fVar234 = auVar95._16_4_;
  auVar106._16_4_ = fVar234 * auVar99._16_4_;
  fVar241 = auVar95._20_4_;
  auVar106._20_4_ = fVar241 * auVar99._20_4_;
  fVar242 = auVar95._24_4_;
  auVar106._24_4_ = fVar242 * auVar99._24_4_;
  auVar106._28_4_ = 1;
  auVar93._4_4_ = auVar97._4_4_ * fVar145;
  auVar93._0_4_ = auVar97._0_4_ * fVar208;
  auVar93._8_4_ = auVar97._8_4_ * fVar232;
  auVar93._12_4_ = auVar97._12_4_ * fVar233;
  auVar93._16_4_ = auVar97._16_4_ * fVar234;
  auVar93._20_4_ = auVar97._20_4_ * fVar241;
  auVar93._24_4_ = auVar97._24_4_ * fVar242;
  auVar93._28_4_ = auVar99._28_4_;
  auVar97._4_4_ = auVar104._4_4_ * fVar145;
  auVar97._0_4_ = auVar104._0_4_ * fVar208;
  auVar97._8_4_ = auVar104._8_4_ * fVar232;
  auVar97._12_4_ = auVar104._12_4_ * fVar233;
  auVar97._16_4_ = auVar104._16_4_ * fVar234;
  auVar97._20_4_ = auVar104._20_4_ * fVar241;
  auVar97._24_4_ = auVar104._24_4_ * fVar242;
  auVar97._28_4_ = auVar95._28_4_;
  auVar6 = vfmadd231ps_fma(auVar106,auVar105,auVar96);
  auVar86 = vfmadd231ps_fma(auVar93,auVar105,auVar101);
  auVar217 = vfmadd231ps_fma(auVar97,auVar105,auVar103);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar116,auVar98);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar116,auVar100);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  auVar217 = vfmadd231ps_fma(ZEXT1632(auVar217),auVar116,auVar102);
  auVar98 = vandps_avx(ZEXT1632(auVar88),auVar112);
  auVar114._8_4_ = 0x219392ef;
  auVar114._0_8_ = 0x219392ef219392ef;
  auVar114._12_4_ = 0x219392ef;
  auVar114._16_4_ = 0x219392ef;
  auVar114._20_4_ = 0x219392ef;
  auVar114._24_4_ = 0x219392ef;
  auVar114._28_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar94._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar245),auVar112);
  uVar84 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar108._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar245._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar245._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar245._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar245._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar89),auVar112);
  uVar84 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar98._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar89._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar89._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar89._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar89._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar113._8_4_ = 0x3f800000;
  auVar113._0_8_ = &DAT_3f8000003f800000;
  auVar113._12_4_ = 0x3f800000;
  auVar113._16_4_ = 0x3f800000;
  auVar113._20_4_ = 0x3f800000;
  auVar113._24_4_ = 0x3f800000;
  auVar113._28_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar94,auVar96,auVar113);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar108);
  auVar245 = vfnmadd213ps_fma(auVar108,auVar96,auVar113);
  auVar245 = vfmadd132ps_fma(ZEXT1632(auVar245),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar89 = vfnmadd213ps_fma(auVar98,auVar96,auVar113);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar96,auVar96);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar6));
  auVar102._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar6));
  auVar97 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar111._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar111._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar111._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar111._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar111._16_4_ = auVar98._16_4_ * 0.0;
  auVar111._20_4_ = auVar98._20_4_ * 0.0;
  auVar111._24_4_ = auVar98._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar8 * 0x10 + uVar78 * -2 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar86));
  auVar103._4_4_ = auVar245._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar245._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar245._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar245._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar86));
  auVar110._0_4_ = auVar245._0_4_ * auVar98._0_4_;
  auVar110._4_4_ = auVar245._4_4_ * auVar98._4_4_;
  auVar110._8_4_ = auVar245._8_4_ * auVar98._8_4_;
  auVar110._12_4_ = auVar245._12_4_ * auVar98._12_4_;
  auVar110._16_4_ = auVar98._16_4_ * 0.0;
  auVar110._20_4_ = auVar98._20_4_ * 0.0;
  auVar110._24_4_ = auVar98._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 + uVar78 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar217));
  auVar104._4_4_ = auVar98._4_4_ * auVar89._4_4_;
  auVar104._0_4_ = auVar98._0_4_ * auVar89._0_4_;
  auVar104._8_4_ = auVar98._8_4_ * auVar89._8_4_;
  auVar104._12_4_ = auVar98._12_4_ * auVar89._12_4_;
  auVar104._16_4_ = auVar98._16_4_ * 0.0;
  auVar104._20_4_ = auVar98._20_4_ * 0.0;
  auVar104._24_4_ = auVar98._24_4_ * 0.0;
  auVar104._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar217));
  auVar109._0_4_ = auVar89._0_4_ * auVar98._0_4_;
  auVar109._4_4_ = auVar89._4_4_ * auVar98._4_4_;
  auVar109._8_4_ = auVar89._8_4_ * auVar98._8_4_;
  auVar109._12_4_ = auVar89._12_4_ * auVar98._12_4_;
  auVar109._16_4_ = auVar98._16_4_ * 0.0;
  auVar109._20_4_ = auVar98._20_4_ * 0.0;
  auVar109._24_4_ = auVar98._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar102,auVar111);
  auVar96 = vpminsd_avx2(auVar103,auVar110);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar109);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar99._4_4_ = uVar5;
  auVar99._0_4_ = uVar5;
  auVar99._8_4_ = uVar5;
  auVar99._12_4_ = uVar5;
  auVar99._16_4_ = uVar5;
  auVar99._20_4_ = uVar5;
  auVar99._24_4_ = uVar5;
  auVar99._28_4_ = uVar5;
  auVar96 = vmaxps_avx512vl(auVar96,auVar99);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar102,auVar111);
  auVar96 = vpmaxsd_avx2(auVar103,auVar110);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar109);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar5;
  auVar100._0_4_ = uVar5;
  auVar100._8_4_ = uVar5;
  auVar100._12_4_ = uVar5;
  auVar100._16_4_ = uVar5;
  auVar100._20_4_ = uVar5;
  auVar100._24_4_ = uVar5;
  auVar100._28_4_ = uVar5;
  auVar96 = vminps_avx512vl(auVar96,auVar100);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar101);
  uVar20 = vpcmpgtd_avx512vl(auVar97,_DAT_0205a920);
  uVar19 = vcmpps_avx512vl(local_420,auVar98,2);
  if ((byte)((byte)uVar19 & (byte)uVar20) == 0) {
    return;
  }
  local_848 = (ulong)(byte)((byte)uVar19 & (byte)uVar20);
  pPVar80 = prim + lVar82 + 0x16;
  local_630 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_868 = pPVar80;
  local_860 = prim;
LAB_01d3d394:
  lVar82 = 0;
  for (uVar84 = local_848; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  local_848 = local_848 - 1 & local_848;
  uVar5 = *(undefined4 *)(prim + lVar82 * 4 + 6);
  uVar84 = (ulong)(uint)((int)lVar82 << 6);
  auVar88 = *(undefined1 (*) [16])(pPVar80 + uVar84);
  if (local_848 != 0) {
    uVar78 = local_848 - 1 & local_848;
    for (uVar77 = local_848; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    }
    if (uVar78 != 0) {
      for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar245 = *(undefined1 (*) [16])(pPVar80 + uVar84 + 0x10);
  auVar89 = *(undefined1 (*) [16])(pPVar80 + uVar84 + 0x20);
  auVar6 = *(undefined1 (*) [16])(pPVar80 + uVar84 + 0x30);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar217 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_4a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_820 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar258 = ZEXT3264(local_820);
  auVar86 = vunpcklps_avx512vl(local_4a0._0_16_,local_820._0_16_);
  local_840 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar257 = ZEXT3264(local_840);
  auVar90 = local_840._0_16_;
  local_7b0 = vinsertps_avx512f(auVar86,auVar90,0x28);
  auVar240 = ZEXT1664(local_7b0);
  auVar92._0_4_ = auVar88._0_4_ + auVar245._0_4_ + auVar89._0_4_ + auVar6._0_4_;
  auVar92._4_4_ = auVar88._4_4_ + auVar245._4_4_ + auVar89._4_4_ + auVar6._4_4_;
  auVar92._8_4_ = auVar88._8_4_ + auVar245._8_4_ + auVar89._8_4_ + auVar6._8_4_;
  auVar92._12_4_ = auVar88._12_4_ + auVar245._12_4_ + auVar89._12_4_ + auVar6._12_4_;
  auVar91._8_4_ = 0x3e800000;
  auVar91._0_8_ = 0x3e8000003e800000;
  auVar91._12_4_ = 0x3e800000;
  auVar86 = vmulps_avx512vl(auVar92,auVar91);
  auVar86 = vsubps_avx(auVar86,auVar217);
  auVar86 = vdpps_avx(auVar86,local_7b0,0x7f);
  fVar208 = *(float *)(ray + k * 4 + 0x30);
  auVar246 = ZEXT464((uint)fVar208);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  uVar81 = *(uint *)(prim + 2);
  auVar229._4_12_ = ZEXT812(0) << 0x20;
  auVar229._0_4_ = local_7c0._0_4_;
  auVar87 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar229);
  auVar7 = vfnmadd213ss_fma(auVar87,local_7c0,ZEXT416(0x40000000));
  local_400 = auVar86._0_4_ * auVar87._0_4_ * auVar7._0_4_;
  auVar228 = ZEXT464((uint)local_400);
  auVar230._4_4_ = local_400;
  auVar230._0_4_ = local_400;
  auVar230._8_4_ = local_400;
  auVar230._12_4_ = local_400;
  fStack_670 = local_400;
  _local_680 = auVar230;
  fStack_66c = local_400;
  fStack_668 = local_400;
  fStack_664 = local_400;
  auVar86 = vfmadd231ps_fma(auVar217,local_7b0,auVar230);
  auVar86 = vblendps_avx(auVar86,ZEXT816(0) << 0x40,8);
  auVar88 = vsubps_avx(auVar88,auVar86);
  auVar89 = vsubps_avx(auVar89,auVar86);
  auVar245 = vsubps_avx(auVar245,auVar86);
  auVar239 = ZEXT1664(auVar245);
  auVar6 = vsubps_avx(auVar6,auVar86);
  local_1e0 = auVar88._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  auVar118._8_4_ = 1;
  auVar118._0_8_ = 0x100000001;
  auVar118._12_4_ = 1;
  auVar118._16_4_ = 1;
  auVar118._20_4_ = 1;
  auVar118._24_4_ = 1;
  auVar118._28_4_ = 1;
  local_740 = ZEXT1632(auVar88);
  local_200 = vpermps_avx2(auVar118,local_740);
  auVar121._8_4_ = 2;
  auVar121._0_8_ = 0x200000002;
  auVar121._12_4_ = 2;
  auVar121._16_4_ = 2;
  auVar121._20_4_ = 2;
  auVar121._24_4_ = 2;
  auVar121._28_4_ = 2;
  local_220 = vpermps_avx2(auVar121,local_740);
  auVar122._8_4_ = 3;
  auVar122._0_8_ = 0x300000003;
  auVar122._12_4_ = 3;
  auVar122._16_4_ = 3;
  auVar122._20_4_ = 3;
  auVar122._24_4_ = 3;
  auVar122._28_4_ = 3;
  local_240 = vpermps_avx2(auVar122,local_740);
  local_260 = auVar245._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_780 = ZEXT1632(auVar245);
  local_280 = vpermps_avx2(auVar118,local_780);
  local_2a0 = vpermps_avx2(auVar121,local_780);
  local_2c0 = vpermps_avx2(auVar122,local_780);
  local_2e0 = auVar89._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_760 = ZEXT1632(auVar89);
  local_300 = vpermps_avx2(auVar118,local_760);
  local_320 = vpermps_avx2(auVar121,local_760);
  local_340 = vpermps_avx2(auVar122,local_760);
  local_360 = auVar6._0_4_;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  _local_7a0 = ZEXT1632(auVar6);
  local_380 = vpermps_avx2(auVar118,_local_7a0);
  local_3a0 = vpermps_avx2(auVar121,_local_7a0);
  local_3c0 = vpermps_avx2(auVar122,_local_7a0);
  auVar88 = vmulss_avx512f(auVar90,auVar90);
  auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),local_820,local_820);
  local_4c0 = vfmadd231ps_avx512vl(auVar98,local_4a0,local_4a0);
  local_3e0._0_4_ = local_4c0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117._16_4_ = 0x7fffffff;
  auVar117._20_4_ = 0x7fffffff;
  auVar117._24_4_ = 0x7fffffff;
  auVar117._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar117);
  local_700 = ZEXT416((uint)local_400);
  local_400 = fVar208 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_610 = vpbroadcastd_avx512vl();
  local_858 = 1;
  local_850 = 0;
  local_620 = vpbroadcastd_avx512vl();
  auVar88 = vsqrtss_avx(local_7c0,local_7c0);
  local_8d4 = auVar88._0_4_;
  auVar88 = vsqrtss_avx(local_7c0,local_7c0);
  local_8d8 = auVar88._0_4_;
  auVar203 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar256 = ZEXT3264(auVar98);
  do {
    local_880 = auVar203._0_16_;
    auVar88 = vmovshdup_avx(local_880);
    fVar145 = auVar203._0_4_;
    fVar249 = auVar88._0_4_ - fVar145;
    fVar190 = fVar249 * 0.04761905;
    auVar222._4_4_ = fVar145;
    auVar222._0_4_ = fVar145;
    auVar222._8_4_ = fVar145;
    auVar222._12_4_ = fVar145;
    auVar222._16_4_ = fVar145;
    auVar222._20_4_ = fVar145;
    auVar222._24_4_ = fVar145;
    auVar222._28_4_ = fVar145;
    local_7e0._4_4_ = fVar249;
    local_7e0._0_4_ = fVar249;
    local_7e0._8_4_ = fVar249;
    local_7e0._12_4_ = fVar249;
    local_7e0._16_4_ = fVar249;
    local_7e0._20_4_ = fVar249;
    local_7e0._24_4_ = fVar249;
    local_7e0._28_4_ = fVar249;
    auVar88 = vfmadd231ps_fma(auVar222,local_7e0,_DAT_02020f20);
    auVar96 = vsubps_avx512vl(auVar256._0_32_,ZEXT1632(auVar88));
    fVar145 = auVar96._0_4_;
    fVar233 = auVar96._4_4_;
    fVar241 = auVar96._8_4_;
    fVar243 = auVar96._12_4_;
    fVar235 = auVar96._16_4_;
    fVar227 = auVar96._20_4_;
    fVar244 = auVar96._24_4_;
    fVar146 = fVar145 * fVar145 * fVar145;
    fVar165 = fVar233 * fVar233 * fVar233;
    auVar37._4_4_ = fVar165;
    auVar37._0_4_ = fVar146;
    fVar166 = fVar241 * fVar241 * fVar241;
    auVar37._8_4_ = fVar166;
    fVar167 = fVar243 * fVar243 * fVar243;
    auVar37._12_4_ = fVar167;
    fVar168 = fVar235 * fVar235 * fVar235;
    auVar37._16_4_ = fVar168;
    fVar169 = fVar227 * fVar227 * fVar227;
    auVar37._20_4_ = fVar169;
    fVar170 = fVar244 * fVar244 * fVar244;
    auVar37._24_4_ = fVar170;
    auVar37._28_4_ = fVar249;
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar98 = vmulps_avx512vl(auVar37,auVar97);
    fVar232 = auVar88._0_4_;
    fVar234 = auVar88._4_4_;
    fVar242 = auVar88._8_4_;
    fVar207 = auVar88._12_4_;
    fVar189 = fVar232 * fVar232 * fVar232;
    fVar204 = fVar234 * fVar234 * fVar234;
    fVar205 = fVar242 * fVar242 * fVar242;
    fVar206 = fVar207 * fVar207 * fVar207;
    auVar203._0_28_ = ZEXT1628(CONCAT412(fVar206,CONCAT48(fVar205,CONCAT44(fVar204,fVar189))));
    auVar256._0_4_ = fVar232 * fVar145;
    auVar256._4_4_ = fVar234 * fVar233;
    auVar256._8_4_ = fVar242 * fVar241;
    auVar256._12_4_ = fVar207 * fVar243;
    auVar256._16_4_ = fVar235 * 0.0;
    auVar256._20_4_ = fVar227 * 0.0;
    auVar256._28_36_ = auVar246._28_36_;
    auVar256._24_4_ = fVar244 * 0.0;
    auVar99 = vmulps_avx512vl(auVar203._0_32_,auVar97);
    fVar249 = auVar99._28_4_ + fVar249;
    auVar38._4_4_ = fVar165 * 0.16666667;
    auVar38._0_4_ = fVar146 * 0.16666667;
    auVar38._8_4_ = fVar166 * 0.16666667;
    auVar38._12_4_ = fVar167 * 0.16666667;
    auVar38._16_4_ = fVar168 * 0.16666667;
    auVar38._20_4_ = fVar169 * 0.16666667;
    auVar38._24_4_ = fVar170 * 0.16666667;
    auVar38._28_4_ = fVar249;
    auVar39._4_4_ =
         (auVar256._4_4_ * fVar233 * 12.0 + auVar256._4_4_ * fVar234 * 6.0 + fVar204 + auVar98._4_4_
         ) * 0.16666667;
    auVar39._0_4_ =
         (auVar256._0_4_ * fVar145 * 12.0 + auVar256._0_4_ * fVar232 * 6.0 + fVar189 + auVar98._0_4_
         ) * 0.16666667;
    auVar39._8_4_ =
         (auVar256._8_4_ * fVar241 * 12.0 + auVar256._8_4_ * fVar242 * 6.0 + fVar205 + auVar98._8_4_
         ) * 0.16666667;
    auVar39._12_4_ =
         (auVar256._12_4_ * fVar243 * 12.0 + auVar256._12_4_ * fVar207 * 6.0 +
         fVar206 + auVar98._12_4_) * 0.16666667;
    auVar39._16_4_ =
         (auVar256._16_4_ * fVar235 * 12.0 + auVar256._16_4_ * 0.0 * 6.0 + auVar98._16_4_ + 0.0) *
         0.16666667;
    auVar39._20_4_ =
         (auVar256._20_4_ * fVar227 * 12.0 + auVar256._20_4_ * 0.0 * 6.0 + auVar98._20_4_ + 0.0) *
         0.16666667;
    auVar39._24_4_ =
         (auVar256._24_4_ * fVar244 * 12.0 + auVar256._24_4_ * 0.0 * 6.0 + auVar98._24_4_ + 0.0) *
         0.16666667;
    auVar39._28_4_ = auVar251._28_4_;
    auVar40._4_4_ =
         (auVar99._4_4_ + fVar165 + auVar256._4_4_ * fVar234 * 12.0 + auVar256._4_4_ * fVar233 * 6.0
         ) * 0.16666667;
    auVar40._0_4_ =
         (auVar99._0_4_ + fVar146 + auVar256._0_4_ * fVar232 * 12.0 + auVar256._0_4_ * fVar145 * 6.0
         ) * 0.16666667;
    auVar40._8_4_ =
         (auVar99._8_4_ + fVar166 + auVar256._8_4_ * fVar242 * 12.0 + auVar256._8_4_ * fVar241 * 6.0
         ) * 0.16666667;
    auVar40._12_4_ =
         (auVar99._12_4_ + fVar167 +
         auVar256._12_4_ * fVar207 * 12.0 + auVar256._12_4_ * fVar243 * 6.0) * 0.16666667;
    auVar40._16_4_ =
         (auVar99._16_4_ + fVar168 + auVar256._16_4_ * 0.0 * 12.0 + auVar256._16_4_ * fVar235 * 6.0)
         * 0.16666667;
    auVar40._20_4_ =
         (auVar99._20_4_ + fVar169 + auVar256._20_4_ * 0.0 * 12.0 + auVar256._20_4_ * fVar227 * 6.0)
         * 0.16666667;
    auVar40._24_4_ =
         (auVar99._24_4_ + fVar170 + auVar256._24_4_ * 0.0 * 12.0 + auVar256._24_4_ * fVar244 * 6.0)
         * 0.16666667;
    auVar40._28_4_ = auVar255._28_4_;
    auVar41._28_4_ = fVar249 + auVar251._28_4_ + auVar228._28_4_;
    auVar41._0_28_ =
         ZEXT1628(CONCAT412(fVar206 * 0.16666667,
                            CONCAT48(fVar205 * 0.16666667,
                                     CONCAT44(fVar204 * 0.16666667,fVar189 * 0.16666667))));
    auVar70._4_4_ = uStack_35c;
    auVar70._0_4_ = local_360;
    auVar70._8_4_ = uStack_358;
    auVar70._12_4_ = uStack_354;
    auVar70._16_4_ = uStack_350;
    auVar70._20_4_ = uStack_34c;
    auVar70._24_4_ = uStack_348;
    auVar70._28_4_ = uStack_344;
    auVar98 = vmulps_avx512vl(auVar70,auVar41);
    auVar99 = vmulps_avx512vl(local_380,auVar41);
    auVar100 = vmulps_avx512vl(local_3a0,auVar41);
    auVar101 = vmulps_avx512vl(local_3c0,auVar41);
    auVar71._4_4_ = uStack_2dc;
    auVar71._0_4_ = local_2e0;
    auVar71._8_4_ = uStack_2d8;
    auVar71._12_4_ = uStack_2d4;
    auVar71._16_4_ = uStack_2d0;
    auVar71._20_4_ = uStack_2cc;
    auVar71._24_4_ = uStack_2c8;
    auVar71._28_4_ = uStack_2c4;
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar40,auVar71);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar40,local_300);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar40,local_320);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_340,auVar40);
    auVar72._4_4_ = uStack_25c;
    auVar72._0_4_ = local_260;
    auVar72._8_4_ = uStack_258;
    auVar72._12_4_ = uStack_254;
    auVar72._16_4_ = uStack_250;
    auVar72._20_4_ = uStack_24c;
    auVar72._24_4_ = uStack_248;
    auVar72._28_4_ = uStack_244;
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar39,auVar72);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar39,local_280);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar39,local_2a0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_2c0,auVar39);
    auVar73._4_4_ = fStack_1dc;
    auVar73._0_4_ = local_1e0;
    auVar73._8_4_ = fStack_1d8;
    auVar73._12_4_ = fStack_1d4;
    auVar73._16_4_ = fStack_1d0;
    auVar73._20_4_ = fStack_1cc;
    auVar73._24_4_ = fStack_1c8;
    auVar73._28_4_ = fStack_1c4;
    auVar245 = vfmadd231ps_fma(auVar98,auVar38,auVar73);
    auVar89 = vfmadd231ps_fma(auVar99,auVar38,local_200);
    auVar6 = vfmadd231ps_fma(auVar100,auVar38,local_220);
    auVar86 = vfmadd231ps_fma(auVar101,local_240,auVar38);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar99 = vxorps_avx512vl(auVar96,auVar98);
    auVar100 = vxorps_avx512vl(ZEXT1632(auVar88),auVar98);
    auVar223._0_4_ = auVar100._0_4_ * fVar232;
    auVar223._4_4_ = auVar100._4_4_ * fVar234;
    auVar223._8_4_ = auVar100._8_4_ * fVar242;
    auVar223._12_4_ = auVar100._12_4_ * fVar207;
    auVar223._16_4_ = auVar100._16_4_ * 0.0;
    auVar223._20_4_ = auVar100._20_4_ * 0.0;
    auVar223._24_4_ = auVar100._24_4_ * 0.0;
    auVar223._28_4_ = 0;
    auVar101 = vmulps_avx512vl(auVar256._0_32_,auVar97);
    auVar98 = vsubps_avx(auVar223,auVar101);
    auVar42._4_4_ = auVar99._4_4_ * fVar233 * 0.5;
    auVar42._0_4_ = auVar99._0_4_ * fVar145 * 0.5;
    auVar42._8_4_ = auVar99._8_4_ * fVar241 * 0.5;
    auVar42._12_4_ = auVar99._12_4_ * fVar243 * 0.5;
    auVar42._16_4_ = auVar99._16_4_ * fVar235 * 0.5;
    auVar42._20_4_ = auVar99._20_4_ * fVar227 * 0.5;
    auVar42._24_4_ = auVar99._24_4_ * fVar244 * 0.5;
    auVar42._28_4_ = auVar96._28_4_;
    auVar43._4_4_ = auVar98._4_4_ * 0.5;
    auVar43._0_4_ = auVar98._0_4_ * 0.5;
    auVar43._8_4_ = auVar98._8_4_ * 0.5;
    auVar43._12_4_ = auVar98._12_4_ * 0.5;
    auVar43._16_4_ = auVar98._16_4_ * 0.5;
    auVar43._20_4_ = auVar98._20_4_ * 0.5;
    auVar43._24_4_ = auVar98._24_4_ * 0.5;
    auVar43._28_4_ = auVar98._28_4_;
    auVar44._4_4_ = (fVar233 * fVar233 + auVar101._4_4_) * 0.5;
    auVar44._0_4_ = (fVar145 * fVar145 + auVar101._0_4_) * 0.5;
    auVar44._8_4_ = (fVar241 * fVar241 + auVar101._8_4_) * 0.5;
    auVar44._12_4_ = (fVar243 * fVar243 + auVar101._12_4_) * 0.5;
    auVar44._16_4_ = (fVar235 * fVar235 + auVar101._16_4_) * 0.5;
    auVar44._20_4_ = (fVar227 * fVar227 + auVar101._20_4_) * 0.5;
    auVar44._24_4_ = (fVar244 * fVar244 + auVar101._24_4_) * 0.5;
    auVar44._28_4_ = auVar239._28_4_ + auVar101._28_4_;
    auVar45._28_4_ = auVar240._28_4_;
    auVar45._0_28_ =
         ZEXT1628(CONCAT412(fVar207 * fVar207 * 0.5,
                            CONCAT48(fVar242 * fVar242 * 0.5,
                                     CONCAT44(fVar234 * fVar234 * 0.5,fVar232 * fVar232 * 0.5))));
    auVar98 = vmulps_avx512vl(auVar70,auVar45);
    auVar96 = vmulps_avx512vl(local_380,auVar45);
    auVar99 = vmulps_avx512vl(local_3a0,auVar45);
    auVar101 = vmulps_avx512vl(local_3c0,auVar45);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar44,auVar71);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar44,local_300);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar44,local_320);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_340,auVar44);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar43,auVar72);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar43,local_280);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar43,local_2a0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_2c0,auVar43);
    auVar88 = vfmadd231ps_fma(auVar98,auVar42,auVar73);
    auVar217 = vfmadd231ps_fma(auVar96,auVar42,local_200);
    auVar7 = vfmadd231ps_fma(auVar99,auVar42,local_220);
    auVar87 = vfmadd231ps_fma(auVar101,local_240,auVar42);
    auVar46._4_4_ = auVar88._4_4_ * fVar190;
    auVar46._0_4_ = auVar88._0_4_ * fVar190;
    auVar46._8_4_ = auVar88._8_4_ * fVar190;
    auVar46._12_4_ = auVar88._12_4_ * fVar190;
    auVar46._16_4_ = fVar190 * 0.0;
    auVar46._20_4_ = fVar190 * 0.0;
    auVar46._24_4_ = fVar190 * 0.0;
    auVar46._28_4_ = auVar100._28_4_;
    auVar250._0_4_ = auVar217._0_4_ * fVar190;
    auVar250._4_4_ = auVar217._4_4_ * fVar190;
    auVar250._8_4_ = auVar217._8_4_ * fVar190;
    auVar250._12_4_ = auVar217._12_4_ * fVar190;
    auVar250._16_4_ = fVar190 * 0.0;
    auVar250._20_4_ = fVar190 * 0.0;
    auVar250._24_4_ = fVar190 * 0.0;
    auVar250._28_4_ = 0;
    auVar251 = ZEXT3264(auVar250);
    auVar254._0_4_ = auVar7._0_4_ * fVar190;
    auVar254._4_4_ = auVar7._4_4_ * fVar190;
    auVar254._8_4_ = auVar7._8_4_ * fVar190;
    auVar254._12_4_ = auVar7._12_4_ * fVar190;
    auVar254._16_4_ = fVar190 * 0.0;
    auVar254._20_4_ = fVar190 * 0.0;
    auVar254._24_4_ = fVar190 * 0.0;
    auVar254._28_4_ = 0;
    auVar255 = ZEXT3264(auVar254);
    fVar145 = auVar87._0_4_ * fVar190;
    fVar232 = auVar87._4_4_ * fVar190;
    auVar47._4_4_ = fVar232;
    auVar47._0_4_ = fVar145;
    fVar233 = auVar87._8_4_ * fVar190;
    auVar47._8_4_ = fVar233;
    fVar234 = auVar87._12_4_ * fVar190;
    auVar47._12_4_ = fVar234;
    auVar47._16_4_ = fVar190 * 0.0;
    auVar47._20_4_ = fVar190 * 0.0;
    auVar47._24_4_ = fVar190 * 0.0;
    auVar47._28_4_ = fStack_1c4;
    auVar88 = vxorps_avx512vl(auVar258._0_16_,auVar258._0_16_);
    auVar102 = vpermt2ps_avx512vl(ZEXT1632(auVar245),_DAT_0205fd20,ZEXT1632(auVar88));
    auVar239 = ZEXT3264(auVar102);
    auVar103 = vpermt2ps_avx512vl(ZEXT1632(auVar89),_DAT_0205fd20,ZEXT1632(auVar88));
    auVar240 = ZEXT3264(auVar103);
    auVar99 = ZEXT1632(auVar88);
    auVar104 = vpermt2ps_avx512vl(ZEXT1632(auVar6),_DAT_0205fd20,auVar99);
    auVar246 = ZEXT3264(auVar104);
    auVar224._0_4_ = fVar145 + auVar86._0_4_;
    auVar224._4_4_ = fVar232 + auVar86._4_4_;
    auVar224._8_4_ = fVar233 + auVar86._8_4_;
    auVar224._12_4_ = fVar234 + auVar86._12_4_;
    auVar224._16_4_ = fVar190 * 0.0 + 0.0;
    auVar224._20_4_ = fVar190 * 0.0 + 0.0;
    auVar224._24_4_ = fVar190 * 0.0 + 0.0;
    auVar224._28_4_ = fStack_1c4 + 0.0;
    auVar98 = vmaxps_avx(ZEXT1632(auVar86),auVar224);
    auVar96 = vminps_avx(ZEXT1632(auVar86),auVar224);
    auVar105 = vpermt2ps_avx512vl(ZEXT1632(auVar86),_DAT_0205fd20,auVar99);
    auVar95 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar99);
    auVar106 = vpermt2ps_avx512vl(auVar250,_DAT_0205fd20,auVar99);
    auVar117 = ZEXT1632(auVar88);
    auVar107 = vpermt2ps_avx512vl(auVar254,_DAT_0205fd20,auVar117);
    auVar228 = ZEXT3264(auVar107);
    auVar99 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar117);
    auVar93 = vsubps_avx512vl(auVar105,auVar99);
    auVar99 = vsubps_avx(auVar102,ZEXT1632(auVar245));
    auVar100 = vsubps_avx(auVar103,ZEXT1632(auVar89));
    local_660 = vsubps_avx512vl(auVar104,ZEXT1632(auVar6));
    auVar101 = vmulps_avx512vl(auVar100,auVar254);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar250,local_660);
    auVar94 = vmulps_avx512vl(local_660,auVar46);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar254,auVar99);
    auVar108 = vmulps_avx512vl(auVar99,auVar250);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar46,auVar100);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar94 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar94);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar101);
    auVar101 = vmulps_avx512vl(local_660,local_660);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar108 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar99);
    auVar109 = vrcp14ps_avx512vl(auVar108);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar110 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar101);
    auVar109 = vfmadd132ps_avx512vl(auVar110,auVar109,auVar109);
    auVar94 = vmulps_avx512vl(auVar94,auVar109);
    auVar110 = vmulps_avx512vl(auVar100,auVar107);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar106,local_660);
    auVar111 = vmulps_avx512vl(local_660,auVar95);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar107,auVar99);
    auVar112 = vmulps_avx512vl(auVar99,auVar106);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar95,auVar100);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar110,auVar109);
    auVar94 = vmaxps_avx512vl(auVar94,auVar109);
    auVar94 = vsqrtps_avx512vl(auVar94);
    auVar109 = vmaxps_avx512vl(auVar93,auVar105);
    auVar98 = vmaxps_avx512vl(auVar98,auVar109);
    auVar109 = vaddps_avx512vl(auVar94,auVar98);
    auVar98 = vminps_avx512vl(auVar93,auVar105);
    auVar98 = vminps_avx(auVar96,auVar98);
    auVar98 = vsubps_avx512vl(auVar98,auVar94);
    auVar123._8_4_ = 0x3f800002;
    auVar123._0_8_ = 0x3f8000023f800002;
    auVar123._12_4_ = 0x3f800002;
    auVar123._16_4_ = 0x3f800002;
    auVar123._20_4_ = 0x3f800002;
    auVar123._24_4_ = 0x3f800002;
    auVar123._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar109,auVar123);
    auVar124._8_4_ = 0x3f7ffffc;
    auVar124._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar124._12_4_ = 0x3f7ffffc;
    auVar124._16_4_ = 0x3f7ffffc;
    auVar124._20_4_ = 0x3f7ffffc;
    auVar124._24_4_ = 0x3f7ffffc;
    auVar124._28_4_ = 0x3f7ffffc;
    auVar105 = vmulps_avx512vl(auVar98,auVar124);
    auVar48._4_4_ = auVar96._4_4_ * auVar96._4_4_;
    auVar48._0_4_ = auVar96._0_4_ * auVar96._0_4_;
    auVar48._8_4_ = auVar96._8_4_ * auVar96._8_4_;
    auVar48._12_4_ = auVar96._12_4_ * auVar96._12_4_;
    auVar48._16_4_ = auVar96._16_4_ * auVar96._16_4_;
    auVar48._20_4_ = auVar96._20_4_ * auVar96._20_4_;
    auVar48._24_4_ = auVar96._24_4_ * auVar96._24_4_;
    auVar48._28_4_ = auVar105._28_4_;
    auVar98 = vrsqrt14ps_avx512vl(auVar108);
    auVar24._8_4_ = 0xbf000000;
    auVar24._0_8_ = 0xbf000000bf000000;
    auVar24._12_4_ = 0xbf000000;
    auVar24._16_4_ = 0xbf000000;
    auVar24._20_4_ = 0xbf000000;
    auVar24._24_4_ = 0xbf000000;
    auVar24._28_4_ = 0xbf000000;
    auVar96 = vmulps_avx512vl(auVar108,auVar24);
    auVar49._4_4_ = auVar98._4_4_ * auVar96._4_4_;
    auVar49._0_4_ = auVar98._0_4_ * auVar96._0_4_;
    auVar49._8_4_ = auVar98._8_4_ * auVar96._8_4_;
    auVar49._12_4_ = auVar98._12_4_ * auVar96._12_4_;
    auVar49._16_4_ = auVar98._16_4_ * auVar96._16_4_;
    auVar49._20_4_ = auVar98._20_4_ * auVar96._20_4_;
    auVar49._24_4_ = auVar98._24_4_ * auVar96._24_4_;
    auVar49._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar49);
    auVar25._8_4_ = 0x3fc00000;
    auVar25._0_8_ = 0x3fc000003fc00000;
    auVar25._12_4_ = 0x3fc00000;
    auVar25._16_4_ = 0x3fc00000;
    auVar25._20_4_ = 0x3fc00000;
    auVar25._24_4_ = 0x3fc00000;
    auVar25._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar25);
    auVar50._4_4_ = auVar93._4_4_ * auVar99._4_4_;
    auVar50._0_4_ = auVar93._0_4_ * auVar99._0_4_;
    auVar50._8_4_ = auVar93._8_4_ * auVar99._8_4_;
    auVar50._12_4_ = auVar93._12_4_ * auVar99._12_4_;
    auVar50._16_4_ = auVar93._16_4_ * auVar99._16_4_;
    auVar50._20_4_ = auVar93._20_4_ * auVar99._20_4_;
    auVar50._24_4_ = auVar93._24_4_ * auVar99._24_4_;
    auVar50._28_4_ = auVar98._28_4_;
    auVar98 = vmulps_avx512vl(auVar100,auVar93);
    auVar96 = vmulps_avx512vl(local_660,auVar93);
    local_8a0 = ZEXT1632(auVar245);
    auVar94 = vsubps_avx512vl(auVar117,local_8a0);
    auVar201 = ZEXT1632(auVar89);
    auVar108 = vsubps_avx512vl(auVar117,auVar201);
    local_800 = ZEXT1632(auVar6);
    auVar109 = vsubps_avx512vl(auVar117,local_800);
    auVar110 = vmulps_avx512vl(auVar257._0_32_,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar258._0_32_,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_4a0,auVar94);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar94,auVar94);
    auVar112 = vmulps_avx512vl(auVar257._0_32_,auVar96);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar98,auVar258._0_32_);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar50,local_4a0);
    auVar96 = vmulps_avx512vl(auVar109,auVar96);
    auVar98 = vfmadd231ps_avx512vl(auVar96,auVar108,auVar98);
    auVar113 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar50);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar98 = vsubps_avx(local_3e0,auVar114);
    auVar96 = vmulps_avx512vl(auVar112,auVar113);
    auVar96 = vsubps_avx512vl(auVar110,auVar96);
    auVar110 = vaddps_avx512vl(auVar96,auVar96);
    auVar96 = vmulps_avx512vl(auVar113,auVar113);
    auVar111 = vsubps_avx512vl(auVar111,auVar96);
    auVar96 = vsubps_avx(auVar111,auVar48);
    auVar115 = vmulps_avx512vl(auVar110,auVar110);
    auVar97 = vmulps_avx512vl(auVar98,auVar97);
    auVar116 = vmulps_avx512vl(auVar97,auVar96);
    auVar116 = vsubps_avx512vl(auVar115,auVar116);
    uVar84 = vcmpps_avx512vl(auVar116,auVar117,5);
    bVar74 = (byte)uVar84;
    if (bVar74 == 0) {
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar117 = vaddps_avx512vl(auVar98,auVar98);
      auVar118 = vrcp14ps_avx512vl(auVar117);
      auVar101 = vfnmadd213ps_avx512vl(auVar117,auVar118,auVar101);
      auVar101 = vfmadd132ps_avx512vl(auVar101,auVar118,auVar118);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar117 = vxorps_avx512vl(auVar110,auVar26);
      auVar117 = vsubps_avx512vl(auVar117,auVar116);
      auVar117 = vmulps_avx512vl(auVar117,auVar101);
      auVar116 = vsubps_avx512vl(auVar116,auVar110);
      auVar101 = vmulps_avx512vl(auVar116,auVar101);
      auVar116 = vfmadd213ps_avx512vl(auVar112,auVar117,auVar113);
      local_500 = vmulps_avx512vl(auVar93,auVar116);
      auVar116 = vfmadd213ps_avx512vl(auVar112,auVar101,auVar113);
      local_520 = vmulps_avx512vl(auVar93,auVar116);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vblendmps_avx512vl(auVar116,auVar117);
      auVar119._0_4_ =
           (uint)(bVar74 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar74 & 1) * local_520._0_4_;
      bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * local_520._4_4_;
      bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * local_520._8_4_;
      bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * local_520._12_4_;
      bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar12 * auVar116._16_4_ | (uint)!bVar12 * local_520._16_4_;
      bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar12 * auVar116._20_4_ | (uint)!bVar12 * local_520._20_4_;
      bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar12 * auVar116._24_4_ | (uint)!bVar12 * local_520._24_4_;
      bVar12 = SUB81(uVar84 >> 7,0);
      auVar119._28_4_ = (uint)bVar12 * auVar116._28_4_ | (uint)!bVar12 * local_520._28_4_;
      auVar213._8_4_ = 0xff800000;
      auVar213._0_8_ = 0xff800000ff800000;
      auVar213._12_4_ = 0xff800000;
      auVar213._16_4_ = 0xff800000;
      auVar213._20_4_ = 0xff800000;
      auVar213._24_4_ = 0xff800000;
      auVar213._28_4_ = 0xff800000;
      auVar116 = vblendmps_avx512vl(auVar213,auVar101);
      auVar120._0_4_ =
           (uint)(bVar74 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar101._0_4_;
      bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * auVar101._4_4_;
      bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * auVar101._8_4_;
      bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * auVar101._12_4_;
      bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar12 * auVar116._16_4_ | (uint)!bVar12 * auVar101._16_4_;
      bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar12 * auVar116._20_4_ | (uint)!bVar12 * auVar101._20_4_;
      bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar12 * auVar116._24_4_ | (uint)!bVar12 * auVar101._24_4_;
      bVar12 = SUB81(uVar84 >> 7,0);
      auVar120._28_4_ = (uint)bVar12 * auVar116._28_4_ | (uint)!bVar12 * auVar101._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar101);
      auVar116 = vmaxps_avx512vl(local_4c0,auVar101);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar116 = vmulps_avx512vl(auVar116,auVar27);
      vandps_avx512vl(auVar98,auVar101);
      uVar77 = vcmpps_avx512vl(auVar116,auVar116,1);
      uVar84 = uVar84 & uVar77;
      bVar79 = (byte)uVar84;
      if (bVar79 != 0) {
        uVar77 = vcmpps_avx512vl(auVar96,_DAT_02020f00,2);
        auVar226._8_4_ = 0xff800000;
        auVar226._0_8_ = 0xff800000ff800000;
        auVar226._12_4_ = 0xff800000;
        auVar226._16_4_ = 0xff800000;
        auVar226._20_4_ = 0xff800000;
        auVar226._24_4_ = 0xff800000;
        auVar226._28_4_ = 0xff800000;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar101 = vblendmps_avx512vl(auVar96,auVar226);
        bVar76 = (byte)uVar77;
        uVar85 = (uint)(bVar76 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar116._0_4_;
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar138 = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar116._4_4_;
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar139 = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar116._8_4_;
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar140 = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar116._12_4_;
        bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar141 = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar116._16_4_;
        bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar142 = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar116._20_4_;
        bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar143 = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar116._24_4_;
        bVar12 = SUB81(uVar77 >> 7,0);
        uVar144 = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar116._28_4_;
        auVar119._0_4_ = (bVar79 & 1) * uVar85 | !(bool)(bVar79 & 1) * auVar119._0_4_;
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar119._4_4_ = bVar12 * uVar138 | !bVar12 * auVar119._4_4_;
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar119._8_4_ = bVar12 * uVar139 | !bVar12 * auVar119._8_4_;
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar119._12_4_ = bVar12 * uVar140 | !bVar12 * auVar119._12_4_;
        bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar119._16_4_ = bVar12 * uVar141 | !bVar12 * auVar119._16_4_;
        bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar119._20_4_ = bVar12 * uVar142 | !bVar12 * auVar119._20_4_;
        bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar119._24_4_ = bVar12 * uVar143 | !bVar12 * auVar119._24_4_;
        bVar12 = SUB81(uVar84 >> 7,0);
        auVar119._28_4_ = bVar12 * uVar144 | !bVar12 * auVar119._28_4_;
        auVar96 = vblendmps_avx512vl(auVar226,auVar96);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar18 = SUB81(uVar77 >> 7,0);
        auVar120._0_4_ =
             (uint)(bVar79 & 1) *
             ((uint)(bVar76 & 1) * auVar96._0_4_ | !(bool)(bVar76 & 1) * uVar85) |
             !(bool)(bVar79 & 1) * auVar120._0_4_;
        bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar120._4_4_ =
             (uint)bVar83 * ((uint)bVar12 * auVar96._4_4_ | !bVar12 * uVar138) |
             !bVar83 * auVar120._4_4_;
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar120._8_4_ =
             (uint)bVar12 * ((uint)bVar13 * auVar96._8_4_ | !bVar13 * uVar139) |
             !bVar12 * auVar120._8_4_;
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar120._12_4_ =
             (uint)bVar12 * ((uint)bVar14 * auVar96._12_4_ | !bVar14 * uVar140) |
             !bVar12 * auVar120._12_4_;
        bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar120._16_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar96._16_4_ | !bVar15 * uVar141) |
             !bVar12 * auVar120._16_4_;
        bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar120._20_4_ =
             (uint)bVar12 * ((uint)bVar16 * auVar96._20_4_ | !bVar16 * uVar142) |
             !bVar12 * auVar120._20_4_;
        bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar120._24_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar96._24_4_ | !bVar17 * uVar143) |
             !bVar12 * auVar120._24_4_;
        bVar12 = SUB81(uVar84 >> 7,0);
        auVar120._28_4_ =
             (uint)bVar12 * ((uint)bVar18 * auVar96._28_4_ | !bVar18 * uVar144) |
             !bVar12 * auVar120._28_4_;
        bVar74 = (~bVar79 | bVar76) & bVar74;
      }
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar256 = ZEXT3264(auVar101);
    if ((bVar74 & 0x7f) == 0) {
      auVar258 = ZEXT3264(local_820);
      auVar257 = ZEXT3264(local_840);
    }
    else {
      fVar145 = *(float *)(ray + k * 4 + 0x80) - (float)local_700._0_4_;
      auVar214._4_4_ = fVar145;
      auVar214._0_4_ = fVar145;
      auVar214._8_4_ = fVar145;
      auVar214._12_4_ = fVar145;
      auVar214._16_4_ = fVar145;
      auVar214._20_4_ = fVar145;
      auVar214._24_4_ = fVar145;
      auVar214._28_4_ = fVar145;
      auVar116 = vminps_avx512vl(auVar214,auVar120);
      auVar69._4_4_ = fStack_3fc;
      auVar69._0_4_ = local_400;
      auVar69._8_4_ = fStack_3f8;
      auVar69._12_4_ = fStack_3f4;
      auVar69._16_4_ = fStack_3f0;
      auVar69._20_4_ = fStack_3ec;
      auVar69._24_4_ = fStack_3e8;
      auVar69._28_4_ = fStack_3e4;
      auVar96 = vmaxps_avx512vl(auVar69,auVar119);
      auVar109 = vmulps_avx512vl(auVar254,auVar109);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar250,auVar109);
      auVar94 = vfmadd213ps_avx512vl(auVar94,auVar46,auVar108);
      auVar257 = ZEXT3264(local_840);
      auVar108 = vmulps_avx512vl(local_840,auVar254);
      auVar258 = ZEXT3264(local_820);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_820,auVar250);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_4a0,auVar46);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar109);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar19 = vcmpps_avx512vl(auVar109,auVar117,1);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar94 = vxorps_avx512vl(auVar94,auVar118);
      auVar121 = vrcp14ps_avx512vl(auVar108);
      auVar122 = vxorps_avx512vl(auVar108,auVar118);
      auVar123 = vfnmadd213ps_avx512vl(auVar121,auVar108,auVar101);
      auVar123 = vfmadd132ps_avx512vl(auVar123,auVar121,auVar121);
      auVar94 = vmulps_avx512vl(auVar123,auVar94);
      uVar20 = vcmpps_avx512vl(auVar108,auVar122,1);
      bVar79 = (byte)uVar19 | (byte)uVar20;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar124 = vblendmps_avx512vl(auVar94,auVar123);
      auVar125._0_4_ =
           (uint)(bVar79 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar121._0_4_;
      bVar12 = (bool)(bVar79 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar12 * auVar124._4_4_ | (uint)!bVar12 * auVar121._4_4_;
      bVar12 = (bool)(bVar79 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar12 * auVar124._8_4_ | (uint)!bVar12 * auVar121._8_4_;
      bVar12 = (bool)(bVar79 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar12 * auVar124._12_4_ | (uint)!bVar12 * auVar121._12_4_;
      bVar12 = (bool)(bVar79 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar12 * auVar124._16_4_ | (uint)!bVar12 * auVar121._16_4_;
      bVar12 = (bool)(bVar79 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar12 * auVar124._20_4_ | (uint)!bVar12 * auVar121._20_4_;
      bVar12 = (bool)(bVar79 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar12 * auVar124._24_4_ | (uint)!bVar12 * auVar121._24_4_;
      auVar125._28_4_ =
           (uint)(bVar79 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar121._28_4_;
      auVar96 = vmaxps_avx(auVar96,auVar125);
      uVar20 = vcmpps_avx512vl(auVar108,auVar122,6);
      bVar79 = (byte)uVar19 | (byte)uVar20;
      auVar255 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar126._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * auVar94._0_4_;
      bVar12 = (bool)(bVar79 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar94._4_4_;
      bVar12 = (bool)(bVar79 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar94._8_4_;
      bVar12 = (bool)(bVar79 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar94._12_4_;
      bVar12 = (bool)(bVar79 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar94._16_4_;
      bVar12 = (bool)(bVar79 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar94._20_4_;
      bVar12 = (bool)(bVar79 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * auVar94._24_4_;
      auVar126._28_4_ =
           (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar94._28_4_;
      auVar94 = vminps_avx(auVar116,auVar126);
      auVar88 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar88),auVar102);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar88),auVar103);
      auVar108 = ZEXT1632(auVar88);
      auVar104 = vsubps_avx512vl(auVar108,auVar104);
      auVar51._4_4_ = auVar104._4_4_ * auVar107._4_4_;
      auVar51._0_4_ = auVar104._0_4_ * auVar107._0_4_;
      auVar51._8_4_ = auVar104._8_4_ * auVar107._8_4_;
      auVar51._12_4_ = auVar104._12_4_ * auVar107._12_4_;
      auVar51._16_4_ = auVar104._16_4_ * auVar107._16_4_;
      auVar51._20_4_ = auVar104._20_4_ * auVar107._20_4_;
      auVar51._24_4_ = auVar104._24_4_ * auVar107._24_4_;
      auVar51._28_4_ = auVar104._28_4_;
      auVar103 = vfnmsub231ps_avx512vl(auVar51,auVar106,auVar103);
      auVar102 = vfnmadd231ps_avx512vl(auVar103,auVar95,auVar102);
      auVar103 = vmulps_avx512vl(local_840,auVar107);
      auVar103 = vfnmsub231ps_avx512vl(auVar103,local_820,auVar106);
      auVar103 = vfnmadd231ps_avx512vl(auVar103,local_4a0,auVar95);
      vandps_avx512vl(auVar103,auVar109);
      uVar19 = vcmpps_avx512vl(auVar103,auVar117,1);
      auVar102 = vxorps_avx512vl(auVar102,auVar118);
      auVar104 = vrcp14ps_avx512vl(auVar103);
      auVar95 = vxorps_avx512vl(auVar103,auVar118);
      auVar107 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar101);
      auVar88 = vfmadd132ps_fma(auVar107,auVar104,auVar104);
      auVar251 = ZEXT1664(auVar88);
      fVar145 = auVar88._0_4_ * auVar102._0_4_;
      fVar232 = auVar88._4_4_ * auVar102._4_4_;
      auVar52._4_4_ = fVar232;
      auVar52._0_4_ = fVar145;
      fVar233 = auVar88._8_4_ * auVar102._8_4_;
      auVar52._8_4_ = fVar233;
      fVar234 = auVar88._12_4_ * auVar102._12_4_;
      auVar52._12_4_ = fVar234;
      fVar241 = auVar102._16_4_ * 0.0;
      auVar52._16_4_ = fVar241;
      fVar242 = auVar102._20_4_ * 0.0;
      auVar52._20_4_ = fVar242;
      fVar243 = auVar102._24_4_ * 0.0;
      auVar52._24_4_ = fVar243;
      auVar52._28_4_ = auVar102._28_4_;
      uVar20 = vcmpps_avx512vl(auVar103,auVar95,1);
      bVar79 = (byte)uVar19 | (byte)uVar20;
      auVar107 = vblendmps_avx512vl(auVar52,auVar123);
      auVar127._0_4_ =
           (uint)(bVar79 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar104._0_4_;
      bVar12 = (bool)(bVar79 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar104._4_4_;
      bVar12 = (bool)(bVar79 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar104._8_4_;
      bVar12 = (bool)(bVar79 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar104._12_4_;
      bVar12 = (bool)(bVar79 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * auVar104._16_4_;
      bVar12 = (bool)(bVar79 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * auVar104._20_4_;
      bVar12 = (bool)(bVar79 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * auVar104._24_4_;
      auVar127._28_4_ =
           (uint)(bVar79 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar104._28_4_;
      auVar246 = ZEXT3264(auVar127);
      _local_6a0 = vmaxps_avx(auVar96,auVar127);
      uVar20 = vcmpps_avx512vl(auVar103,auVar95,6);
      bVar79 = (byte)uVar19 | (byte)uVar20;
      auVar128._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * (int)fVar145;
      bVar12 = (bool)(bVar79 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar232;
      bVar12 = (bool)(bVar79 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar233;
      bVar12 = (bool)(bVar79 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar234;
      bVar12 = (bool)(bVar79 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar241;
      bVar12 = (bool)(bVar79 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar242;
      bVar12 = (bool)(bVar79 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar12 * 0x7f800000 | (uint)!bVar12 * (int)fVar243;
      auVar128._28_4_ =
           (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar102._28_4_;
      auVar240 = ZEXT3264(auVar128);
      local_460 = vminps_avx(auVar94,auVar128);
      auVar239 = ZEXT3264(local_460);
      uVar19 = vcmpps_avx512vl(_local_6a0,local_460,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar19;
      if (bVar74 != 0) {
        auVar102 = vmaxps_avx512vl(auVar108,auVar105);
        auVar96 = vminps_avx512vl(local_500,auVar101);
        auVar58 = ZEXT412(0);
        auVar246 = ZEXT1264(auVar58) << 0x20;
        auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar58) << 0x20);
        auVar103 = vminps_avx512vl(local_520,auVar101);
        auVar251 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar53._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar96._28_4_ + 7.0;
        auVar88 = vfmadd213ps_fma(auVar53,local_7e0,auVar222);
        local_500 = ZEXT1632(auVar88);
        auVar96 = vmaxps_avx(auVar103,ZEXT1232(auVar58) << 0x20);
        auVar54._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar96._28_4_ + 7.0;
        auVar88 = vfmadd213ps_fma(auVar54,local_7e0,auVar222);
        local_520 = ZEXT1632(auVar88);
        auVar215._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar215._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar215._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar215._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar215._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar215._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar215._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar215._28_4_ = 0;
        auVar96 = vsubps_avx(auVar111,auVar215);
        auVar97 = vmulps_avx512vl(auVar97,auVar96);
        auVar97 = vsubps_avx512vl(auVar115,auVar97);
        uVar19 = vcmpps_avx512vl(auVar97,ZEXT1232(auVar58) << 0x20,5);
        bVar79 = (byte)uVar19;
        if (bVar79 == 0) {
          auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar101 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar240 = ZEXT864(0) << 0x20;
          auVar129._8_4_ = 0x7f800000;
          auVar129._0_8_ = 0x7f8000007f800000;
          auVar129._12_4_ = 0x7f800000;
          auVar129._16_4_ = 0x7f800000;
          auVar129._20_4_ = 0x7f800000;
          auVar129._24_4_ = 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar130._8_4_ = 0xff800000;
          auVar130._0_8_ = 0xff800000ff800000;
          auVar130._12_4_ = 0xff800000;
          auVar130._16_4_ = 0xff800000;
          auVar130._20_4_ = 0xff800000;
          auVar130._24_4_ = 0xff800000;
          auVar130._28_4_ = 0xff800000;
        }
        else {
          auVar89 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
          uVar84 = vcmpps_avx512vl(auVar97,auVar108,5);
          auVar97 = vsqrtps_avx(auVar97);
          auVar225._0_4_ = auVar98._0_4_ + auVar98._0_4_;
          auVar225._4_4_ = auVar98._4_4_ + auVar98._4_4_;
          auVar225._8_4_ = auVar98._8_4_ + auVar98._8_4_;
          auVar225._12_4_ = auVar98._12_4_ + auVar98._12_4_;
          auVar225._16_4_ = auVar98._16_4_ + auVar98._16_4_;
          auVar225._20_4_ = auVar98._20_4_ + auVar98._20_4_;
          auVar225._24_4_ = auVar98._24_4_ + auVar98._24_4_;
          auVar225._28_4_ = auVar98._28_4_ + auVar98._28_4_;
          auVar102 = vrcp14ps_avx512vl(auVar225);
          auVar101 = vfnmadd213ps_avx512vl(auVar225,auVar102,auVar101);
          auVar88 = vfmadd132ps_fma(auVar101,auVar102,auVar102);
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar28._16_4_ = 0x80000000;
          auVar28._20_4_ = 0x80000000;
          auVar28._24_4_ = 0x80000000;
          auVar28._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar110,auVar28);
          auVar101 = vsubps_avx(auVar101,auVar97);
          auVar55._4_4_ = auVar101._4_4_ * auVar88._4_4_;
          auVar55._0_4_ = auVar101._0_4_ * auVar88._0_4_;
          auVar55._8_4_ = auVar101._8_4_ * auVar88._8_4_;
          auVar55._12_4_ = auVar101._12_4_ * auVar88._12_4_;
          auVar55._16_4_ = auVar101._16_4_ * 0.0;
          auVar55._20_4_ = auVar101._20_4_ * 0.0;
          auVar55._24_4_ = auVar101._24_4_ * 0.0;
          auVar55._28_4_ = 0x3e000000;
          auVar97 = vsubps_avx512vl(auVar97,auVar110);
          auVar56._4_4_ = auVar97._4_4_ * auVar88._4_4_;
          auVar56._0_4_ = auVar97._0_4_ * auVar88._0_4_;
          auVar56._8_4_ = auVar97._8_4_ * auVar88._8_4_;
          auVar56._12_4_ = auVar97._12_4_ * auVar88._12_4_;
          auVar56._16_4_ = auVar97._16_4_ * 0.0;
          auVar56._20_4_ = auVar97._20_4_ * 0.0;
          auVar56._24_4_ = auVar97._24_4_ * 0.0;
          auVar56._28_4_ = 0x7f800000;
          auVar255 = ZEXT3264(auVar56);
          auVar97 = vfmadd213ps_avx512vl(auVar112,auVar55,auVar113);
          auVar57._4_4_ = auVar93._4_4_ * auVar97._4_4_;
          auVar57._0_4_ = auVar93._0_4_ * auVar97._0_4_;
          auVar57._8_4_ = auVar93._8_4_ * auVar97._8_4_;
          auVar57._12_4_ = auVar93._12_4_ * auVar97._12_4_;
          auVar57._16_4_ = auVar93._16_4_ * auVar97._16_4_;
          auVar57._20_4_ = auVar93._20_4_ * auVar97._20_4_;
          auVar57._24_4_ = auVar93._24_4_ * auVar97._24_4_;
          auVar57._28_4_ = auVar101._28_4_;
          auVar101 = vmulps_avx512vl(local_4a0,auVar55);
          auVar97 = vmulps_avx512vl(local_820,auVar55);
          auVar102 = vmulps_avx512vl(local_840,auVar55);
          auVar103 = vfmadd213ps_avx512vl(auVar99,auVar57,local_8a0);
          auVar101 = vsubps_avx512vl(auVar101,auVar103);
          auVar103 = vfmadd213ps_avx512vl(auVar100,auVar57,auVar201);
          auVar97 = vsubps_avx512vl(auVar97,auVar103);
          auVar88 = vfmadd213ps_fma(auVar57,local_660,local_800);
          auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar88));
          auVar240 = ZEXT3264(auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar112,auVar56,auVar113);
          auVar102 = vmulps_avx512vl(auVar93,auVar102);
          auVar103 = vmulps_avx512vl(local_4a0,auVar56);
          auVar104 = vmulps_avx512vl(local_820,auVar56);
          auVar105 = vmulps_avx512vl(local_840,auVar56);
          auVar88 = vfmadd213ps_fma(auVar99,auVar102,local_8a0);
          auVar99 = vsubps_avx(auVar103,ZEXT1632(auVar88));
          auVar246 = ZEXT3264(auVar99);
          auVar88 = vfmadd213ps_fma(auVar100,auVar102,auVar201);
          auVar99 = vsubps_avx512vl(auVar104,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(local_660,auVar102,local_800);
          auVar100 = vsubps_avx512vl(auVar105,ZEXT1632(auVar88));
          auVar156._8_4_ = 0x7f800000;
          auVar156._0_8_ = 0x7f8000007f800000;
          auVar156._12_4_ = 0x7f800000;
          auVar156._16_4_ = 0x7f800000;
          auVar156._20_4_ = 0x7f800000;
          auVar156._24_4_ = 0x7f800000;
          auVar156._28_4_ = 0x7f800000;
          auVar102 = vblendmps_avx512vl(auVar156,auVar55);
          bVar12 = (bool)((byte)uVar84 & 1);
          auVar129._0_4_ = (uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar245._0_4_;
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar245._4_4_;
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar245._8_4_;
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar245._12_4_;
          iVar1 = (uint)((byte)(uVar84 >> 4) & 1) * auVar102._16_4_;
          auVar129._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar84 >> 5) & 1) * auVar102._20_4_;
          auVar129._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar84 >> 6) & 1) * auVar102._24_4_;
          auVar129._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar84 >> 7) * auVar102._28_4_;
          auVar129._28_4_ = iVar4;
          auVar157._8_4_ = 0xff800000;
          auVar157._0_8_ = 0xff800000ff800000;
          auVar157._12_4_ = 0xff800000;
          auVar157._16_4_ = 0xff800000;
          auVar157._20_4_ = 0xff800000;
          auVar157._24_4_ = 0xff800000;
          auVar157._28_4_ = 0xff800000;
          auVar102 = vblendmps_avx512vl(auVar157,auVar56);
          bVar12 = (bool)((byte)uVar84 & 1);
          auVar130._0_4_ = (uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * -0x800000;
          bVar12 = SUB81(uVar84 >> 7,0);
          auVar130._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * -0x800000;
          auVar236._8_4_ = 0x7fffffff;
          auVar236._0_8_ = 0x7fffffff7fffffff;
          auVar236._12_4_ = 0x7fffffff;
          auVar236._16_4_ = 0x7fffffff;
          auVar236._20_4_ = 0x7fffffff;
          auVar236._24_4_ = 0x7fffffff;
          auVar236._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar114,auVar236);
          auVar251 = ZEXT3264(local_4c0);
          auVar102 = vmaxps_avx(local_4c0,auVar130);
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar102 = vmulps_avx512vl(auVar102,auVar29);
          auVar98 = vandps_avx(auVar98,auVar236);
          uVar77 = vcmpps_avx512vl(auVar98,auVar102,1);
          uVar84 = uVar84 & uVar77;
          bVar76 = (byte)uVar84;
          if (bVar76 != 0) {
            uVar77 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar89),2);
            auVar237._8_4_ = 0xff800000;
            auVar237._0_8_ = 0xff800000ff800000;
            auVar237._12_4_ = 0xff800000;
            auVar237._16_4_ = 0xff800000;
            auVar237._20_4_ = 0xff800000;
            auVar237._24_4_ = 0xff800000;
            auVar237._28_4_ = 0xff800000;
            auVar248._8_4_ = 0x7f800000;
            auVar248._0_8_ = 0x7f8000007f800000;
            auVar248._12_4_ = 0x7f800000;
            auVar248._16_4_ = 0x7f800000;
            auVar248._20_4_ = 0x7f800000;
            auVar248._24_4_ = 0x7f800000;
            auVar248._28_4_ = 0x7f800000;
            auVar98 = vblendmps_avx512vl(auVar248,auVar237);
            bVar75 = (byte)uVar77;
            uVar85 = (uint)(bVar75 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar102._0_4_
            ;
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            uVar138 = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar102._4_4_;
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            uVar139 = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar102._8_4_;
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            uVar140 = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar102._12_4_;
            bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
            uVar141 = (uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar102._16_4_;
            bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
            uVar142 = (uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar102._20_4_;
            bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
            uVar143 = (uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar102._24_4_;
            bVar12 = SUB81(uVar77 >> 7,0);
            uVar144 = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar102._28_4_;
            auVar129._0_4_ = (bVar76 & 1) * uVar85 | !(bool)(bVar76 & 1) * auVar129._0_4_;
            bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
            auVar129._4_4_ = bVar12 * uVar138 | !bVar12 * auVar129._4_4_;
            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
            auVar129._8_4_ = bVar12 * uVar139 | !bVar12 * auVar129._8_4_;
            bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
            auVar129._12_4_ = bVar12 * uVar140 | !bVar12 * auVar129._12_4_;
            bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
            auVar129._16_4_ = bVar12 * uVar141 | (uint)!bVar12 * iVar1;
            bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
            auVar129._20_4_ = bVar12 * uVar142 | (uint)!bVar12 * iVar2;
            bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
            auVar129._24_4_ = bVar12 * uVar143 | (uint)!bVar12 * iVar3;
            bVar12 = SUB81(uVar84 >> 7,0);
            auVar129._28_4_ = bVar12 * uVar144 | (uint)!bVar12 * iVar4;
            auVar98 = vblendmps_avx512vl(auVar237,auVar248);
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
            bVar18 = SUB81(uVar77 >> 7,0);
            auVar130._0_4_ =
                 (uint)(bVar76 & 1) *
                 ((uint)(bVar75 & 1) * auVar98._0_4_ | !(bool)(bVar75 & 1) * uVar85) |
                 !(bool)(bVar76 & 1) * auVar130._0_4_;
            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
            auVar130._4_4_ =
                 (uint)bVar83 * ((uint)bVar12 * auVar98._4_4_ | !bVar12 * uVar138) |
                 !bVar83 * auVar130._4_4_;
            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
            auVar130._8_4_ =
                 (uint)bVar12 * ((uint)bVar13 * auVar98._8_4_ | !bVar13 * uVar139) |
                 !bVar12 * auVar130._8_4_;
            bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
            auVar130._12_4_ =
                 (uint)bVar12 * ((uint)bVar14 * auVar98._12_4_ | !bVar14 * uVar140) |
                 !bVar12 * auVar130._12_4_;
            bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
            auVar130._16_4_ =
                 (uint)bVar12 * ((uint)bVar15 * auVar98._16_4_ | !bVar15 * uVar141) |
                 !bVar12 * auVar130._16_4_;
            bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
            auVar130._20_4_ =
                 (uint)bVar12 * ((uint)bVar16 * auVar98._20_4_ | !bVar16 * uVar142) |
                 !bVar12 * auVar130._20_4_;
            bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
            auVar130._24_4_ =
                 (uint)bVar12 * ((uint)bVar17 * auVar98._24_4_ | !bVar17 * uVar143) |
                 !bVar12 * auVar130._24_4_;
            bVar12 = SUB81(uVar84 >> 7,0);
            auVar130._28_4_ =
                 (uint)bVar12 * ((uint)bVar18 * auVar98._28_4_ | !bVar18 * uVar144) |
                 !bVar12 * auVar130._28_4_;
            bVar79 = (~bVar76 | bVar75) & bVar79;
          }
        }
        auVar247._8_4_ = 0x7fffffff;
        auVar247._0_8_ = 0x7fffffff7fffffff;
        auVar247._12_4_ = 0x7fffffff;
        auVar98 = vmulps_avx512vl(local_840,auVar100);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_820,auVar99);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_4a0,auVar246._0_32_);
        _local_1c0 = _local_6a0;
        local_1a0 = vminps_avx(local_460,auVar129);
        auVar231._8_4_ = 0x7fffffff;
        auVar231._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x7fffffff;
        auVar231._16_4_ = 0x7fffffff;
        auVar231._20_4_ = 0x7fffffff;
        auVar231._24_4_ = 0x7fffffff;
        auVar231._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(auVar98,auVar231);
        _local_480 = vmaxps_avx(_local_6a0,auVar130);
        auVar228 = ZEXT3264(_local_480);
        auVar158._8_4_ = 0x3e99999a;
        auVar158._0_8_ = 0x3e99999a3e99999a;
        auVar158._12_4_ = 0x3e99999a;
        auVar158._16_4_ = 0x3e99999a;
        auVar158._20_4_ = 0x3e99999a;
        auVar158._24_4_ = 0x3e99999a;
        auVar158._28_4_ = 0x3e99999a;
        uVar19 = vcmpps_avx512vl(auVar98,auVar158,1);
        local_8dc = (undefined4)uVar19;
        uVar19 = vcmpps_avx512vl(_local_6a0,local_1a0,2);
        bVar76 = (byte)uVar19 & bVar74;
        _local_560 = _local_480;
        uVar20 = vcmpps_avx512vl(_local_480,local_460,2);
        if ((bVar74 & ((byte)uVar20 | (byte)uVar19)) == 0) {
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar256 = ZEXT3264(auVar98);
        }
        else {
          auVar98 = vmulps_avx512vl(local_840,auVar240._0_32_);
          auVar98 = vfmadd213ps_avx512vl(auVar97,local_820,auVar98);
          auVar98 = vfmadd213ps_avx512vl(auVar101,local_4a0,auVar98);
          auVar98 = vandps_avx(auVar98,auVar231);
          uVar19 = vcmpps_avx512vl(auVar98,auVar158,1);
          local_8e4 = (uint)(byte)~bVar79;
          bVar79 = (byte)uVar19 | ~bVar79;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar98 = vpblendmd_avx512vl(auVar159,auVar30);
          local_440._0_4_ = (uint)(bVar79 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
          bVar12 = (bool)(bVar79 >> 1 & 1);
          local_440._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar79 >> 2 & 1);
          local_440._8_4_ = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar79 >> 3 & 1);
          local_440._12_4_ = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar79 >> 4 & 1);
          local_440._16_4_ = (uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar79 >> 5 & 1);
          local_440._20_4_ = (uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar79 >> 6 & 1);
          local_440._24_4_ = (uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * 2;
          local_440._28_4_ = (uint)(bVar79 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
          local_4e0 = vpbroadcastd_avx512vl();
          uVar19 = vpcmpd_avx512vl(local_4e0,local_440,5);
          local_8e0 = (uint)bVar76;
          bVar76 = (byte)uVar19 & bVar76;
          if (bVar76 != 0) {
            auVar245 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar88 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar89 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar6 = vminps_avx(auVar245,auVar89);
            auVar245 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar89 = vmaxps_avx(auVar88,auVar245);
            auVar88 = vandps_avx(auVar247,auVar6);
            auVar245 = vandps_avx(auVar247,auVar89);
            auVar88 = vmaxps_avx(auVar88,auVar245);
            auVar245 = vmovshdup_avx(auVar88);
            auVar245 = vmaxss_avx(auVar245,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar245);
            fVar145 = auVar88._0_4_ * 1.9073486e-06;
            local_710 = vshufps_avx(auVar89,auVar89,0xff);
            local_540 = (float)local_6a0._0_4_ + (float)local_680._0_4_;
            fStack_53c = (float)local_6a0._4_4_ + (float)local_680._4_4_;
            fStack_538 = fStack_698 + fStack_678;
            fStack_534 = fStack_694 + fStack_674;
            fStack_530 = fStack_690 + fStack_670;
            fStack_52c = fStack_68c + fStack_66c;
            fStack_528 = fStack_688 + fStack_668;
            fStack_524 = fStack_684 + fStack_664;
            do {
              auVar160._8_4_ = 0x7f800000;
              auVar160._0_8_ = 0x7f8000007f800000;
              auVar160._12_4_ = 0x7f800000;
              auVar160._16_4_ = 0x7f800000;
              auVar160._20_4_ = 0x7f800000;
              auVar160._24_4_ = 0x7f800000;
              auVar160._28_4_ = 0x7f800000;
              auVar98 = vblendmps_avx512vl(auVar160,_local_6a0);
              auVar131._0_4_ =
                   (uint)(bVar76 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar76 >> 1 & 1);
              auVar131._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar76 >> 2 & 1);
              auVar131._8_4_ = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar76 >> 3 & 1);
              auVar131._12_4_ = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar76 >> 4 & 1);
              auVar131._16_4_ = (uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar76 >> 5 & 1);
              auVar131._20_4_ = (uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar131._24_4_ =
                   (uint)(bVar76 >> 6) * auVar98._24_4_ | (uint)!(bool)(bVar76 >> 6) * 0x7f800000;
              auVar131._28_4_ = 0x7f800000;
              auVar98 = vshufps_avx(auVar131,auVar131,0xb1);
              auVar98 = vminps_avx(auVar131,auVar98);
              auVar96 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar96);
              auVar96 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar96);
              uVar19 = vcmpps_avx512vl(auVar131,auVar98,0);
              bVar75 = (byte)uVar19 & bVar76;
              bVar79 = bVar76;
              if (bVar75 != 0) {
                bVar79 = bVar75;
              }
              iVar2 = 0;
              for (uVar85 = (uint)bVar79; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar85 = *(uint *)(local_500 + (uint)(iVar2 << 2));
              uVar138 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
              fVar232 = local_8d8;
              if ((float)local_7c0._0_4_ < 0.0) {
                fVar232 = sqrtf((float)local_7c0._0_4_);
              }
              auVar246 = ZEXT464(uVar85);
              auVar239 = ZEXT464(uVar138);
              lVar82 = 4;
              do {
                fVar233 = auVar239._0_4_;
                auVar148._4_4_ = fVar233;
                auVar148._0_4_ = fVar233;
                auVar148._8_4_ = fVar233;
                auVar148._12_4_ = fVar233;
                auVar88 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_7b0);
                fVar244 = auVar246._0_4_;
                fVar227 = 1.0 - fVar244;
                fVar242 = fVar227 * fVar227 * fVar227;
                fVar234 = fVar244 * fVar244;
                fVar235 = fVar244 * fVar234;
                auVar245 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar242),
                                           ZEXT416((uint)fVar235));
                fVar241 = fVar244 * fVar227;
                auVar217 = ZEXT416((uint)fVar227);
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar241 * 6.0)),
                                         ZEXT416((uint)(fVar241 * fVar227)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar235),
                                          ZEXT416((uint)fVar242));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * fVar227 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar244 * fVar241)));
                fVar242 = fVar242 * 0.16666667;
                fVar243 = (auVar245._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar207 = (auVar89._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar235 = fVar235 * 0.16666667;
                auVar191._0_4_ = fVar235 * (float)local_7a0._0_4_;
                auVar191._4_4_ = fVar235 * (float)local_7a0._4_4_;
                auVar191._8_4_ = fVar235 * fStack_798;
                auVar191._12_4_ = fVar235 * fStack_794;
                auVar218._4_4_ = fVar207;
                auVar218._0_4_ = fVar207;
                auVar218._8_4_ = fVar207;
                auVar218._12_4_ = fVar207;
                auVar245 = vfmadd132ps_fma(auVar218,auVar191,local_760._0_16_);
                auVar192._4_4_ = fVar243;
                auVar192._0_4_ = fVar243;
                auVar192._8_4_ = fVar243;
                auVar192._12_4_ = fVar243;
                auVar245 = vfmadd132ps_fma(auVar192,auVar245,local_780._0_16_);
                auVar171._4_4_ = fVar242;
                auVar171._0_4_ = fVar242;
                auVar171._8_4_ = fVar242;
                auVar171._12_4_ = fVar242;
                auVar245 = vfmadd132ps_fma(auVar171,auVar245,local_740._0_16_);
                local_660._0_16_ = auVar245;
                auVar88 = vsubps_avx(auVar88,auVar245);
                local_7e0._0_16_ = auVar88;
                auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
                auVar245 = auVar246._0_16_;
                local_800._0_16_ = auVar88;
                if (auVar88._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar234;
                  auVar251._0_4_ = sqrtf(auVar88._0_4_);
                  auVar251._4_60_ = extraout_var;
                  auVar88 = auVar251._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  local_8a0._0_4_ = fVar234;
                }
                auVar6 = vfnmsub213ss_fma(auVar245,auVar245,ZEXT416((uint)(fVar241 * 4.0)));
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * 4.0)),auVar217,auVar217);
                fVar234 = fVar227 * -fVar227 * 0.5;
                fVar241 = auVar6._0_4_ * 0.5;
                fVar242 = auVar89._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar209._0_4_ = (float)local_8a0._0_4_ * (float)local_7a0._0_4_;
                auVar209._4_4_ = (float)local_8a0._0_4_ * (float)local_7a0._4_4_;
                auVar209._8_4_ = (float)local_8a0._0_4_ * fStack_798;
                auVar209._12_4_ = (float)local_8a0._0_4_ * fStack_794;
                auVar172._4_4_ = fVar242;
                auVar172._0_4_ = fVar242;
                auVar172._8_4_ = fVar242;
                auVar172._12_4_ = fVar242;
                auVar89 = vfmadd132ps_fma(auVar172,auVar209,local_760._0_16_);
                auVar193._4_4_ = fVar241;
                auVar193._0_4_ = fVar241;
                auVar193._8_4_ = fVar241;
                auVar193._12_4_ = fVar241;
                auVar89 = vfmadd132ps_fma(auVar193,auVar89,local_780._0_16_);
                auVar252._4_4_ = fVar234;
                auVar252._0_4_ = fVar234;
                auVar252._8_4_ = fVar234;
                auVar252._12_4_ = fVar234;
                local_8a0._0_16_ = vfmadd132ps_fma(auVar252,auVar89,local_740._0_16_);
                local_6c0 = vdpps_avx(local_8a0._0_16_,local_8a0._0_16_,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar234 = local_6c0._0_4_;
                auVar89 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar234));
                fVar241 = auVar89._0_4_;
                local_6d0 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar234));
                auVar89 = vfnmadd213ss_fma(local_6d0,local_6c0,ZEXT416(0x40000000));
                uVar85 = auVar88._0_4_;
                local_6b0 = fVar227;
                fStack_6ac = fVar227;
                fStack_6a8 = fVar227;
                fStack_6a4 = fVar227;
                if (fVar234 < -fVar234) {
                  auVar255._0_4_ = sqrtf(fVar234);
                  auVar255._4_60_ = extraout_var_00;
                  auVar88 = ZEXT416(uVar85);
                  auVar86 = auVar255._0_16_;
                  auVar6 = local_8a0._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx512f(local_6c0,local_6c0);
                  auVar6 = local_8a0._0_16_;
                }
                fVar234 = fVar241 * 1.5 + fVar234 * -0.5 * fVar241 * fVar241 * fVar241;
                auVar149._0_4_ = auVar6._0_4_ * fVar234;
                auVar149._4_4_ = auVar6._4_4_ * fVar234;
                auVar149._8_4_ = auVar6._8_4_ * fVar234;
                auVar149._12_4_ = auVar6._12_4_ * fVar234;
                auVar7 = vdpps_avx(local_7e0._0_16_,auVar149,0x7f);
                fVar243 = auVar88._0_4_;
                fVar241 = auVar7._0_4_;
                auVar150._0_4_ = fVar241 * fVar241;
                auVar150._4_4_ = auVar7._4_4_ * auVar7._4_4_;
                auVar150._8_4_ = auVar7._8_4_ * auVar7._8_4_;
                auVar150._12_4_ = auVar7._12_4_ * auVar7._12_4_;
                auVar90 = vsubps_avx512vl(local_800._0_16_,auVar150);
                fVar242 = auVar90._0_4_;
                auVar173._4_12_ = ZEXT812(0) << 0x20;
                auVar173._0_4_ = fVar242;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
                auVar91 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar92 = vmulss_avx512f(auVar90,ZEXT416(0xbf000000));
                if (fVar242 < 0.0) {
                  local_6f0 = fVar234;
                  fStack_6ec = fVar234;
                  fStack_6e8 = fVar234;
                  fStack_6e4 = fVar234;
                  local_6e0 = auVar87;
                  fVar242 = sqrtf(fVar242);
                  auVar92 = ZEXT416(auVar92._0_4_);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar88 = ZEXT416(uVar85);
                  auVar6 = local_8a0._0_16_;
                  auVar87 = local_6e0;
                  fVar234 = local_6f0;
                  fVar207 = fStack_6ec;
                  fVar235 = fStack_6e8;
                  fVar227 = fStack_6e4;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar90,auVar90);
                  fVar242 = auVar90._0_4_;
                  fVar207 = fVar234;
                  fVar235 = fVar234;
                  fVar227 = fVar234;
                }
                auVar255 = ZEXT1664(auVar6);
                auVar240 = ZEXT1664(local_7e0._0_16_);
                auVar247._8_4_ = 0x7fffffff;
                auVar247._0_8_ = 0x7fffffff7fffffff;
                auVar247._12_4_ = 0x7fffffff;
                auVar258 = ZEXT3264(local_820);
                auVar257 = ZEXT3264(local_840);
                auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar217,auVar245);
                auVar245 = vfmadd231ss_fma(auVar217,auVar245,SUB6416(ZEXT464(0xc0000000),0));
                auVar194._0_4_ = fVar244 * (float)local_7a0._0_4_;
                auVar194._4_4_ = fVar244 * (float)local_7a0._4_4_;
                auVar194._8_4_ = fVar244 * fStack_798;
                auVar194._12_4_ = fVar244 * fStack_794;
                auVar210._0_4_ = auVar245._0_4_;
                auVar210._4_4_ = auVar210._0_4_;
                auVar210._8_4_ = auVar210._0_4_;
                auVar210._12_4_ = auVar210._0_4_;
                auVar245 = vfmadd132ps_fma(auVar210,auVar194,local_760._0_16_);
                auVar174._0_4_ = auVar90._0_4_;
                auVar174._4_4_ = auVar174._0_4_;
                auVar174._8_4_ = auVar174._0_4_;
                auVar174._12_4_ = auVar174._0_4_;
                auVar245 = vfmadd132ps_fma(auVar174,auVar245,local_780._0_16_);
                auVar65._4_4_ = fStack_6ac;
                auVar65._0_4_ = local_6b0;
                auVar65._8_4_ = fStack_6a8;
                auVar65._12_4_ = fStack_6a4;
                auVar245 = vfmadd132ps_fma(auVar65,auVar245,local_740._0_16_);
                auVar175._0_4_ = auVar245._0_4_ * (float)local_6c0._0_4_;
                auVar175._4_4_ = auVar245._4_4_ * (float)local_6c0._0_4_;
                auVar175._8_4_ = auVar245._8_4_ * (float)local_6c0._0_4_;
                auVar175._12_4_ = auVar245._12_4_ * (float)local_6c0._0_4_;
                auVar245 = vdpps_avx(auVar6,auVar245,0x7f);
                fVar190 = auVar245._0_4_;
                auVar195._0_4_ = auVar6._0_4_ * fVar190;
                auVar195._4_4_ = auVar6._4_4_ * fVar190;
                auVar195._8_4_ = auVar6._8_4_ * fVar190;
                auVar195._12_4_ = auVar6._12_4_ * fVar190;
                auVar245 = vsubps_avx(auVar175,auVar195);
                fVar190 = auVar89._0_4_ * (float)local_6d0._0_4_;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar133._16_16_ = local_840._16_16_;
                auVar90 = vxorps_avx512vl(auVar6,auVar22);
                auVar219._0_4_ = fVar234 * auVar245._0_4_ * fVar190;
                auVar219._4_4_ = fVar207 * auVar245._4_4_ * fVar190;
                auVar219._8_4_ = fVar235 * auVar245._8_4_ * fVar190;
                auVar219._12_4_ = fVar227 * auVar245._12_4_ * fVar190;
                auVar251 = ZEXT1664(auVar149);
                auVar245 = vdpps_avx(auVar90,auVar149,0x7f);
                auVar217 = vmaxss_avx(ZEXT416((uint)fVar145),
                                      ZEXT416((uint)(fVar233 * fVar232 * 1.9073486e-06)));
                auVar86 = vdivss_avx512f(ZEXT416((uint)fVar145),auVar86);
                auVar89 = vdpps_avx(local_7e0._0_16_,auVar219,0x7f);
                auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar145),auVar217);
                auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar243 + 1.0)),auVar86,auVar88);
                auVar88 = vdpps_avx(local_7b0,auVar149,0x7f);
                fVar234 = auVar245._0_4_ + auVar89._0_4_;
                auVar245 = vdpps_avx(local_7e0._0_16_,auVar90,0x7f);
                auVar90 = vmulss_avx512f(auVar92,auVar87);
                auVar87 = vmulss_avx512f(auVar87,auVar87);
                auVar89 = vdpps_avx(local_7e0._0_16_,local_7b0,0x7f);
                auVar91 = vaddss_avx512f(auVar91,ZEXT416((uint)(auVar90._0_4_ * auVar87._0_4_)));
                auVar87 = vfnmadd231ss_fma(auVar245,auVar7,ZEXT416((uint)fVar234));
                auVar90 = vfnmadd231ss_fma(auVar89,auVar7,auVar88);
                auVar245 = vpermilps_avx(local_660._0_16_,0xff);
                fVar242 = fVar242 - auVar245._0_4_;
                auVar245 = vshufps_avx(auVar6,auVar6,0xff);
                auVar89 = vfmsub213ss_fma(auVar87,auVar91,auVar245);
                fVar243 = auVar90._0_4_ * auVar91._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar89._0_4_)),
                                          ZEXT416((uint)fVar234),ZEXT416((uint)fVar243));
                fVar235 = auVar87._0_4_;
                fVar207 = fVar241 * (auVar89._0_4_ / fVar235);
                auVar228 = ZEXT464((uint)fVar207);
                fVar244 = fVar244 - (fVar241 * (fVar243 / fVar235) -
                                    fVar242 * (auVar88._0_4_ / fVar235));
                auVar246 = ZEXT464((uint)fVar244);
                fVar233 = fVar233 - (fVar242 * (fVar234 / fVar235) - fVar207);
                auVar239 = ZEXT464((uint)fVar233);
                auVar88 = vandps_avx(auVar7,auVar247);
                if (auVar86._0_4_ <= auVar88._0_4_) {
LAB_01d3ea9c:
                  bVar12 = false;
                }
                else {
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar217._0_4_)),
                                            local_710,ZEXT416(0x36000000));
                  auVar88 = vandps_avx(auVar247,ZEXT416((uint)fVar242));
                  if (auVar89._0_4_ <= auVar88._0_4_) goto LAB_01d3ea9c;
                  fVar233 = fVar233 + (float)local_700._0_4_;
                  auVar239 = ZEXT464((uint)fVar233);
                  bVar12 = true;
                  if ((((fVar208 <= fVar233) &&
                       (fVar234 = *(float *)(ray + k * 4 + 0x80), fVar233 <= fVar234)) &&
                      (0.0 <= fVar244)) && (fVar244 <= 1.0)) {
                    auVar133._0_16_ = ZEXT816(0) << 0x20;
                    auVar132._4_28_ = auVar133._4_28_;
                    auVar132._0_4_ = local_800._0_4_;
                    auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar132._0_16_);
                    fVar241 = auVar88._0_4_;
                    auVar88 = vmulss_avx512f(local_800._0_16_,ZEXT416(0xbf000000));
                    pGVar10 = (context->scene->geometries).items[uVar81].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar241 = fVar241 * 1.5 + auVar88._0_4_ * fVar241 * fVar241 * fVar241;
                      auVar176._0_4_ = local_7e0._0_4_ * fVar241;
                      auVar176._4_4_ = local_7e0._4_4_ * fVar241;
                      auVar176._8_4_ = local_7e0._8_4_ * fVar241;
                      auVar176._12_4_ = local_7e0._12_4_ * fVar241;
                      auVar86 = vfmadd213ps_fma(auVar245,auVar176,auVar6);
                      auVar88 = vshufps_avx(auVar176,auVar176,0xc9);
                      auVar245 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar177._0_4_ = auVar176._0_4_ * auVar245._0_4_;
                      auVar177._4_4_ = auVar176._4_4_ * auVar245._4_4_;
                      auVar177._8_4_ = auVar176._8_4_ * auVar245._8_4_;
                      auVar177._12_4_ = auVar176._12_4_ * auVar245._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar177,auVar6,auVar88);
                      auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar245 = vshufps_avx(auVar86,auVar86,0xc9);
                      auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                      auVar151._0_4_ = auVar86._0_4_ * auVar89._0_4_;
                      auVar151._4_4_ = auVar86._4_4_ * auVar89._4_4_;
                      auVar151._8_4_ = auVar86._8_4_ * auVar89._8_4_;
                      auVar151._12_4_ = auVar86._12_4_ * auVar89._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar151,auVar88,auVar245);
                      uVar147 = auVar88._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        uVar9 = vextractps_avx(auVar88,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar9;
                        uVar9 = vextractps_avx(auVar88,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar147;
                        *(float *)(ray + k * 4 + 0xf0) = fVar244;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar5;
                        *(uint *)(ray + k * 4 + 0x120) = uVar81;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_600 = (RTCHitN  [16])vshufps_avx(auVar88,auVar88,0x55);
                        auStack_5f0 = vshufps_avx(auVar88,auVar88,0xaa);
                        local_5e0 = uVar147;
                        uStack_5dc = uVar147;
                        uStack_5d8 = uVar147;
                        uStack_5d4 = uVar147;
                        local_5d0 = fVar244;
                        fStack_5cc = fVar244;
                        fStack_5c8 = fVar244;
                        fStack_5c4 = fVar244;
                        local_5c0 = ZEXT416(0) << 0x20;
                        local_5b0 = local_620._0_8_;
                        uStack_5a8 = local_620._8_8_;
                        local_5a0 = local_610;
                        vpcmpeqd_avx2(ZEXT1632(local_610),ZEXT1632(local_610));
                        uStack_58c = context->user->instID[0];
                        local_590 = uStack_58c;
                        uStack_588 = uStack_58c;
                        uStack_584 = uStack_58c;
                        uStack_580 = context->user->instPrimID[0];
                        uStack_57c = uStack_580;
                        uStack_578 = uStack_580;
                        uStack_574 = uStack_580;
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        local_900 = local_630._0_8_;
                        uStack_8f8 = local_630._8_8_;
                        local_8d0.valid = (int *)&local_900;
                        local_8d0.geometryUserPtr = pGVar10->userPtr;
                        local_8d0.context = context->user;
                        local_8d0.hit = local_600;
                        local_8d0.N = 4;
                        local_8d0.ray = (RTCRayN *)ray;
                        if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar228 = ZEXT464((uint)fVar207);
                          auVar240 = ZEXT1664(local_7e0._0_16_);
                          auVar251 = ZEXT1664(auVar149);
                          auVar255 = ZEXT1664(auVar6);
                          (*pGVar10->intersectionFilterN)(&local_8d0);
                          auVar239 = ZEXT1664(ZEXT416((uint)fVar233));
                          auVar246 = ZEXT1664(ZEXT416((uint)fVar244));
                          auVar257 = ZEXT3264(local_840);
                          auVar258 = ZEXT3264(local_820);
                          auVar247._8_4_ = 0x7fffffff;
                          auVar247._0_8_ = 0x7fffffff7fffffff;
                          auVar247._12_4_ = 0x7fffffff;
                        }
                        auVar61._8_8_ = uStack_8f8;
                        auVar61._0_8_ = local_900;
                        uVar84 = vptestmd_avx512vl(auVar61,auVar61);
                        if ((uVar84 & 0xf) != 0) {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar228 = ZEXT1664(auVar228._0_16_);
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            auVar251 = ZEXT1664(auVar251._0_16_);
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            (*p_Var11)(&local_8d0);
                            auVar239 = ZEXT1664(ZEXT416((uint)fVar233));
                            auVar246 = ZEXT1664(ZEXT416((uint)fVar244));
                            auVar257 = ZEXT3264(local_840);
                            auVar258 = ZEXT3264(local_820);
                            auVar247._8_4_ = 0x7fffffff;
                            auVar247._0_8_ = 0x7fffffff7fffffff;
                            auVar247._12_4_ = 0x7fffffff;
                          }
                          auVar62._8_8_ = uStack_8f8;
                          auVar62._0_8_ = local_900;
                          uVar84 = vptestmd_avx512vl(auVar62,auVar62);
                          uVar84 = uVar84 & 0xf;
                          bVar79 = (byte)uVar84;
                          if (bVar79 != 0) {
                            iVar3 = *(int *)(local_8d0.hit + 4);
                            iVar4 = *(int *)(local_8d0.hit + 8);
                            iVar1 = *(int *)(local_8d0.hit + 0xc);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xc0) =
                                 (uint)(bVar79 & 1) * *(int *)local_8d0.hit |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_8d0.ray + 0xc0);
                            *(uint *)(local_8d0.ray + 0xc4) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0xc4);
                            *(uint *)(local_8d0.ray + 200) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 200);
                            *(uint *)(local_8d0.ray + 0xcc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0xcc);
                            iVar3 = *(int *)(local_8d0.hit + 0x14);
                            iVar4 = *(int *)(local_8d0.hit + 0x18);
                            iVar1 = *(int *)(local_8d0.hit + 0x1c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xd0) =
                                 (uint)(bVar79 & 1) * *(int *)(local_8d0.hit + 0x10) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_8d0.ray + 0xd0);
                            *(uint *)(local_8d0.ray + 0xd4) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0xd4);
                            *(uint *)(local_8d0.ray + 0xd8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xd8);
                            *(uint *)(local_8d0.ray + 0xdc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0xdc);
                            iVar3 = *(int *)(local_8d0.hit + 0x24);
                            iVar4 = *(int *)(local_8d0.hit + 0x28);
                            iVar1 = *(int *)(local_8d0.hit + 0x2c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xe0) =
                                 (uint)(bVar79 & 1) * *(int *)(local_8d0.hit + 0x20) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_8d0.ray + 0xe0);
                            *(uint *)(local_8d0.ray + 0xe4) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0xe4);
                            *(uint *)(local_8d0.ray + 0xe8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xe8);
                            *(uint *)(local_8d0.ray + 0xec) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0xec);
                            iVar3 = *(int *)(local_8d0.hit + 0x34);
                            iVar4 = *(int *)(local_8d0.hit + 0x38);
                            iVar1 = *(int *)(local_8d0.hit + 0x3c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xf0) =
                                 (uint)(bVar79 & 1) * *(int *)(local_8d0.hit + 0x30) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_8d0.ray + 0xf0);
                            *(uint *)(local_8d0.ray + 0xf4) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0xf4);
                            *(uint *)(local_8d0.ray + 0xf8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xf8);
                            *(uint *)(local_8d0.ray + 0xfc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0xfc);
                            iVar3 = *(int *)(local_8d0.hit + 0x44);
                            iVar4 = *(int *)(local_8d0.hit + 0x48);
                            iVar1 = *(int *)(local_8d0.hit + 0x4c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0x100) =
                                 (uint)(bVar79 & 1) * *(int *)(local_8d0.hit + 0x40) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_8d0.ray + 0x100);
                            *(uint *)(local_8d0.ray + 0x104) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0x104);
                            *(uint *)(local_8d0.ray + 0x108) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0x108);
                            *(uint *)(local_8d0.ray + 0x10c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0x10c);
                            auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x50));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x110) = auVar88;
                            auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x60));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x120) = auVar88;
                            auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x70));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x130) = auVar88;
                            auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x80));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x140) = auVar88;
                            goto LAB_01d3ea9f;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar234;
                      }
                    }
                  }
                }
LAB_01d3ea9f:
                bVar83 = lVar82 != 0;
                lVar82 = lVar82 + -1;
              } while ((!bVar12) && (bVar83));
              auVar67._4_4_ = fStack_53c;
              auVar67._0_4_ = local_540;
              auVar67._8_4_ = fStack_538;
              auVar67._12_4_ = fStack_534;
              auVar67._16_4_ = fStack_530;
              auVar67._20_4_ = fStack_52c;
              auVar67._24_4_ = fStack_528;
              auVar67._28_4_ = fStack_524;
              uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar31._4_4_ = uVar147;
              auVar31._0_4_ = uVar147;
              auVar31._8_4_ = uVar147;
              auVar31._12_4_ = uVar147;
              auVar31._16_4_ = uVar147;
              auVar31._20_4_ = uVar147;
              auVar31._24_4_ = uVar147;
              auVar31._28_4_ = uVar147;
              uVar19 = vcmpps_avx512vl(auVar67,auVar31,2);
              bVar76 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar76 & (byte)uVar19;
            } while (bVar76 != 0);
          }
          auVar161._0_4_ = (float)local_560._0_4_ + (float)local_680._0_4_;
          auVar161._4_4_ = (float)local_560._4_4_ + (float)local_680._4_4_;
          auVar161._8_4_ = fStack_558 + fStack_678;
          auVar161._12_4_ = fStack_554 + fStack_674;
          auVar161._16_4_ = fStack_550 + fStack_670;
          auVar161._20_4_ = fStack_54c + fStack_66c;
          auVar161._24_4_ = fStack_548 + fStack_668;
          auVar161._28_4_ = fStack_544 + fStack_664;
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar32._4_4_ = uVar147;
          auVar32._0_4_ = uVar147;
          auVar32._8_4_ = uVar147;
          auVar32._12_4_ = uVar147;
          auVar32._16_4_ = uVar147;
          auVar32._20_4_ = uVar147;
          auVar32._24_4_ = uVar147;
          auVar32._28_4_ = uVar147;
          uVar19 = vcmpps_avx512vl(auVar161,auVar32,2);
          bVar79 = (byte)local_8dc | (byte)local_8e4;
          bVar74 = (byte)uVar20 & bVar74 & (byte)uVar19;
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar98 = vpblendmd_avx512vl(auVar162,auVar33);
          local_560._0_4_ = (uint)(bVar79 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
          bVar12 = (bool)(bVar79 >> 1 & 1);
          local_560._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * 2;
          bVar12 = (bool)(bVar79 >> 2 & 1);
          fStack_558 = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar79 >> 3 & 1);
          fStack_554 = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar79 >> 4 & 1);
          fStack_550 = (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar79 >> 5 & 1);
          fStack_54c = (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * 2);
          bVar12 = (bool)(bVar79 >> 6 & 1);
          fStack_548 = (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * 2);
          fStack_544 = (float)((uint)(bVar79 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2
                              );
          uVar19 = vpcmpd_avx512vl(_local_560,local_4e0,2);
          bVar79 = (byte)uVar19 & bVar74;
          if (bVar79 != 0) {
            auVar245 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar88 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar89 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar6 = vminps_avx(auVar245,auVar89);
            auVar245 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar89 = vmaxps_avx(auVar88,auVar245);
            auVar88 = vandps_avx(auVar247,auVar6);
            auVar245 = vandps_avx(auVar247,auVar89);
            auVar88 = vmaxps_avx(auVar88,auVar245);
            auVar245 = vmovshdup_avx(auVar88);
            auVar245 = vmaxss_avx(auVar245,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar245);
            fVar145 = auVar88._0_4_ * 1.9073486e-06;
            local_710 = vshufps_avx(auVar89,auVar89,0xff);
            _local_6a0 = _local_480;
            local_540 = (float)local_480._0_4_ + (float)local_680._0_4_;
            fStack_53c = (float)local_480._4_4_ + (float)local_680._4_4_;
            fStack_538 = fStack_478 + fStack_678;
            fStack_534 = fStack_474 + fStack_674;
            fStack_530 = fStack_470 + fStack_670;
            fStack_52c = fStack_46c + fStack_66c;
            fStack_528 = fStack_468 + fStack_668;
            fStack_524 = fStack_464 + fStack_664;
            do {
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar98 = vblendmps_avx512vl(auVar163,_local_6a0);
              auVar134._0_4_ =
                   (uint)(bVar79 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar79 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar79 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar79 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar79 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar79 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * 0x7f800000;
              auVar134._24_4_ =
                   (uint)(bVar79 >> 6) * auVar98._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar98 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar98 = vminps_avx(auVar134,auVar98);
              auVar96 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar96);
              auVar96 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar96);
              uVar19 = vcmpps_avx512vl(auVar134,auVar98,0);
              bVar75 = (byte)uVar19 & bVar79;
              bVar76 = bVar79;
              if (bVar75 != 0) {
                bVar76 = bVar75;
              }
              iVar2 = 0;
              for (uVar85 = (uint)bVar76; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar85 = *(uint *)(local_520 + (uint)(iVar2 << 2));
              uVar138 = *(uint *)(local_460 + (uint)(iVar2 << 2));
              fVar232 = local_8d4;
              if ((float)local_7c0._0_4_ < 0.0) {
                fVar232 = sqrtf((float)local_7c0._0_4_);
              }
              auVar246 = ZEXT464(uVar85);
              auVar240 = ZEXT464(uVar138);
              lVar82 = 4;
              do {
                fVar233 = auVar240._0_4_;
                auVar152._4_4_ = fVar233;
                auVar152._0_4_ = fVar233;
                auVar152._8_4_ = fVar233;
                auVar152._12_4_ = fVar233;
                auVar88 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_7b0);
                fVar244 = auVar246._0_4_;
                fVar227 = 1.0 - fVar244;
                fVar242 = fVar227 * fVar227 * fVar227;
                fVar234 = fVar244 * fVar244;
                fVar235 = fVar244 * fVar234;
                auVar245 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar242),
                                           ZEXT416((uint)fVar235));
                fVar241 = fVar244 * fVar227;
                auVar217 = ZEXT416((uint)fVar227);
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar241 * 6.0)),
                                         ZEXT416((uint)(fVar241 * fVar227)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar235),
                                          ZEXT416((uint)fVar242));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * fVar227 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar244 * fVar241)));
                fVar242 = fVar242 * 0.16666667;
                fVar243 = (auVar245._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar207 = (auVar89._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar235 = fVar235 * 0.16666667;
                auVar196._0_4_ = fVar235 * (float)local_7a0._0_4_;
                auVar196._4_4_ = fVar235 * (float)local_7a0._4_4_;
                auVar196._8_4_ = fVar235 * fStack_798;
                auVar196._12_4_ = fVar235 * fStack_794;
                auVar220._4_4_ = fVar207;
                auVar220._0_4_ = fVar207;
                auVar220._8_4_ = fVar207;
                auVar220._12_4_ = fVar207;
                auVar245 = vfmadd132ps_fma(auVar220,auVar196,local_760._0_16_);
                auVar197._4_4_ = fVar243;
                auVar197._0_4_ = fVar243;
                auVar197._8_4_ = fVar243;
                auVar197._12_4_ = fVar243;
                auVar245 = vfmadd132ps_fma(auVar197,auVar245,local_780._0_16_);
                auVar178._4_4_ = fVar242;
                auVar178._0_4_ = fVar242;
                auVar178._8_4_ = fVar242;
                auVar178._12_4_ = fVar242;
                auVar245 = vfmadd132ps_fma(auVar178,auVar245,local_740._0_16_);
                local_660._0_16_ = auVar245;
                auVar88 = vsubps_avx(auVar88,auVar245);
                local_7e0._0_16_ = auVar88;
                auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
                auVar245 = auVar246._0_16_;
                local_800._0_16_ = auVar88;
                if (auVar88._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar234;
                  auVar228._0_4_ = sqrtf(auVar88._0_4_);
                  auVar228._4_60_ = extraout_var_01;
                  auVar88 = auVar228._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  local_8a0._0_4_ = fVar234;
                }
                auVar6 = vfnmsub213ss_fma(auVar245,auVar245,ZEXT416((uint)(fVar241 * 4.0)));
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * 4.0)),auVar217,auVar217);
                fVar234 = fVar227 * -fVar227 * 0.5;
                fVar241 = auVar6._0_4_ * 0.5;
                fVar242 = auVar89._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar211._0_4_ = (float)local_8a0._0_4_ * (float)local_7a0._0_4_;
                auVar211._4_4_ = (float)local_8a0._0_4_ * (float)local_7a0._4_4_;
                auVar211._8_4_ = (float)local_8a0._0_4_ * fStack_798;
                auVar211._12_4_ = (float)local_8a0._0_4_ * fStack_794;
                auVar179._4_4_ = fVar242;
                auVar179._0_4_ = fVar242;
                auVar179._8_4_ = fVar242;
                auVar179._12_4_ = fVar242;
                auVar89 = vfmadd132ps_fma(auVar179,auVar211,local_760._0_16_);
                auVar198._4_4_ = fVar241;
                auVar198._0_4_ = fVar241;
                auVar198._8_4_ = fVar241;
                auVar198._12_4_ = fVar241;
                auVar89 = vfmadd132ps_fma(auVar198,auVar89,local_780._0_16_);
                auVar253._4_4_ = fVar234;
                auVar253._0_4_ = fVar234;
                auVar253._8_4_ = fVar234;
                auVar253._12_4_ = fVar234;
                local_8a0._0_16_ = vfmadd132ps_fma(auVar253,auVar89,local_740._0_16_);
                local_6c0 = vdpps_avx(local_8a0._0_16_,local_8a0._0_16_,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar234 = local_6c0._0_4_;
                auVar89 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar234));
                fVar241 = auVar89._0_4_;
                local_6d0 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar234));
                auVar89 = vfnmadd213ss_fma(local_6d0,local_6c0,ZEXT416(0x40000000));
                uVar85 = auVar88._0_4_;
                local_6b0 = fVar227;
                fStack_6ac = fVar227;
                fStack_6a8 = fVar227;
                fStack_6a4 = fVar227;
                if (fVar234 < -fVar234) {
                  auVar239._0_4_ = sqrtf(fVar234);
                  auVar239._4_60_ = extraout_var_02;
                  auVar88 = ZEXT416(uVar85);
                  auVar86 = auVar239._0_16_;
                  auVar6 = local_8a0._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx512f(local_6c0,local_6c0);
                  auVar6 = local_8a0._0_16_;
                }
                fVar234 = fVar241 * 1.5 + fVar234 * -0.5 * fVar241 * fVar241 * fVar241;
                auVar153._0_4_ = auVar6._0_4_ * fVar234;
                auVar153._4_4_ = auVar6._4_4_ * fVar234;
                auVar153._8_4_ = auVar6._8_4_ * fVar234;
                auVar153._12_4_ = auVar6._12_4_ * fVar234;
                auVar7 = vdpps_avx(local_7e0._0_16_,auVar153,0x7f);
                fVar243 = auVar88._0_4_;
                fVar241 = auVar7._0_4_;
                auVar154._0_4_ = fVar241 * fVar241;
                auVar154._4_4_ = auVar7._4_4_ * auVar7._4_4_;
                auVar154._8_4_ = auVar7._8_4_ * auVar7._8_4_;
                auVar154._12_4_ = auVar7._12_4_ * auVar7._12_4_;
                auVar90 = vsubps_avx512vl(local_800._0_16_,auVar154);
                fVar242 = auVar90._0_4_;
                auVar180._4_12_ = ZEXT812(0) << 0x20;
                auVar180._0_4_ = fVar242;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
                auVar91 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar92 = vmulss_avx512f(auVar90,ZEXT416(0xbf000000));
                if (fVar242 < 0.0) {
                  local_6f0 = fVar234;
                  fStack_6ec = fVar234;
                  fStack_6e8 = fVar234;
                  fStack_6e4 = fVar234;
                  local_6e0 = auVar87;
                  fVar242 = sqrtf(fVar242);
                  auVar92 = ZEXT416(auVar92._0_4_);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar88 = ZEXT416(uVar85);
                  auVar6 = local_8a0._0_16_;
                  auVar87 = local_6e0;
                  fVar234 = local_6f0;
                  fVar207 = fStack_6ec;
                  fVar235 = fStack_6e8;
                  fVar227 = fStack_6e4;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar90,auVar90);
                  fVar242 = auVar90._0_4_;
                  fVar207 = fVar234;
                  fVar235 = fVar234;
                  fVar227 = fVar234;
                }
                auVar255 = ZEXT1664(auVar6);
                auVar238._8_4_ = 0x7fffffff;
                auVar238._0_8_ = 0x7fffffff7fffffff;
                auVar238._12_4_ = 0x7fffffff;
                auVar239 = ZEXT1664(auVar238);
                auVar258 = ZEXT3264(local_820);
                auVar257 = ZEXT3264(local_840);
                auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar217,auVar245);
                auVar245 = vfmadd231ss_fma(auVar217,auVar245,SUB6416(ZEXT464(0xc0000000),0));
                auVar199._0_4_ = fVar244 * (float)local_7a0._0_4_;
                auVar199._4_4_ = fVar244 * (float)local_7a0._4_4_;
                auVar199._8_4_ = fVar244 * fStack_798;
                auVar199._12_4_ = fVar244 * fStack_794;
                auVar212._0_4_ = auVar245._0_4_;
                auVar212._4_4_ = auVar212._0_4_;
                auVar212._8_4_ = auVar212._0_4_;
                auVar212._12_4_ = auVar212._0_4_;
                auVar245 = vfmadd132ps_fma(auVar212,auVar199,local_760._0_16_);
                auVar181._0_4_ = auVar90._0_4_;
                auVar181._4_4_ = auVar181._0_4_;
                auVar181._8_4_ = auVar181._0_4_;
                auVar181._12_4_ = auVar181._0_4_;
                auVar245 = vfmadd132ps_fma(auVar181,auVar245,local_780._0_16_);
                auVar66._4_4_ = fStack_6ac;
                auVar66._0_4_ = local_6b0;
                auVar66._8_4_ = fStack_6a8;
                auVar66._12_4_ = fStack_6a4;
                auVar245 = vfmadd132ps_fma(auVar66,auVar245,local_740._0_16_);
                auVar182._0_4_ = auVar245._0_4_ * (float)local_6c0._0_4_;
                auVar182._4_4_ = auVar245._4_4_ * (float)local_6c0._0_4_;
                auVar182._8_4_ = auVar245._8_4_ * (float)local_6c0._0_4_;
                auVar182._12_4_ = auVar245._12_4_ * (float)local_6c0._0_4_;
                auVar245 = vdpps_avx(auVar6,auVar245,0x7f);
                fVar190 = auVar245._0_4_;
                auVar200._0_4_ = auVar6._0_4_ * fVar190;
                auVar200._4_4_ = auVar6._4_4_ * fVar190;
                auVar200._8_4_ = auVar6._8_4_ * fVar190;
                auVar200._12_4_ = auVar6._12_4_ * fVar190;
                auVar245 = vsubps_avx(auVar182,auVar200);
                fVar190 = auVar89._0_4_ * (float)local_6d0._0_4_;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar136._16_16_ = local_840._16_16_;
                auVar90 = vxorps_avx512vl(auVar6,auVar23);
                auVar221._0_4_ = fVar234 * auVar245._0_4_ * fVar190;
                auVar221._4_4_ = fVar207 * auVar245._4_4_ * fVar190;
                auVar221._8_4_ = fVar235 * auVar245._8_4_ * fVar190;
                auVar221._12_4_ = fVar227 * auVar245._12_4_ * fVar190;
                auVar251 = ZEXT1664(auVar153);
                auVar245 = vdpps_avx(auVar90,auVar153,0x7f);
                auVar217 = vmaxss_avx(ZEXT416((uint)fVar145),
                                      ZEXT416((uint)(fVar233 * fVar232 * 1.9073486e-06)));
                auVar86 = vdivss_avx512f(ZEXT416((uint)fVar145),auVar86);
                auVar89 = vdpps_avx(local_7e0._0_16_,auVar221,0x7f);
                auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar145),auVar217);
                auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar243 + 1.0)),auVar86,auVar88);
                auVar88 = vdpps_avx(local_7b0,auVar153,0x7f);
                fVar234 = auVar245._0_4_ + auVar89._0_4_;
                auVar245 = vdpps_avx(local_7e0._0_16_,auVar90,0x7f);
                auVar90 = vmulss_avx512f(auVar92,auVar87);
                auVar87 = vmulss_avx512f(auVar87,auVar87);
                auVar89 = vdpps_avx(local_7e0._0_16_,local_7b0,0x7f);
                auVar91 = vaddss_avx512f(auVar91,ZEXT416((uint)(auVar90._0_4_ * auVar87._0_4_)));
                auVar87 = vfnmadd231ss_fma(auVar245,auVar7,ZEXT416((uint)fVar234));
                auVar90 = vfnmadd231ss_fma(auVar89,auVar7,auVar88);
                auVar245 = vpermilps_avx(local_660._0_16_,0xff);
                fVar242 = fVar242 - auVar245._0_4_;
                auVar245 = vshufps_avx(auVar6,auVar6,0xff);
                auVar89 = vfmsub213ss_fma(auVar87,auVar91,auVar245);
                fVar243 = auVar90._0_4_ * auVar91._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar89._0_4_)),
                                          ZEXT416((uint)fVar234),ZEXT416((uint)fVar243));
                fVar235 = auVar87._0_4_;
                fVar207 = fVar241 * (auVar89._0_4_ / fVar235);
                auVar228 = ZEXT464((uint)fVar207);
                fVar244 = fVar244 - (fVar241 * (fVar243 / fVar235) -
                                    fVar242 * (auVar88._0_4_ / fVar235));
                auVar246 = ZEXT464((uint)fVar244);
                fVar233 = fVar233 - (fVar242 * (fVar234 / fVar235) - fVar207);
                auVar240 = ZEXT464((uint)fVar233);
                auVar88 = vandps_avx(auVar7,auVar238);
                if (auVar86._0_4_ <= auVar88._0_4_) {
LAB_01d3f659:
                  bVar12 = false;
                }
                else {
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar217._0_4_)),
                                            local_710,ZEXT416(0x36000000));
                  auVar88 = vandps_avx(auVar238,ZEXT416((uint)fVar242));
                  if (auVar89._0_4_ <= auVar88._0_4_) goto LAB_01d3f659;
                  fVar233 = fVar233 + (float)local_700._0_4_;
                  auVar240 = ZEXT464((uint)fVar233);
                  bVar12 = true;
                  if ((((fVar208 <= fVar233) &&
                       (fVar234 = *(float *)(ray + k * 4 + 0x80), fVar233 <= fVar234)) &&
                      (0.0 <= fVar244)) && (fVar244 <= 1.0)) {
                    auVar136._0_16_ = ZEXT816(0) << 0x20;
                    auVar135._4_28_ = auVar136._4_28_;
                    auVar135._0_4_ = local_800._0_4_;
                    auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar135._0_16_);
                    fVar241 = auVar88._0_4_;
                    auVar88 = vmulss_avx512f(local_800._0_16_,ZEXT416(0xbf000000));
                    pGVar10 = (context->scene->geometries).items[uVar81].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar241 = fVar241 * 1.5 + auVar88._0_4_ * fVar241 * fVar241 * fVar241;
                      auVar183._0_4_ = local_7e0._0_4_ * fVar241;
                      auVar183._4_4_ = local_7e0._4_4_ * fVar241;
                      auVar183._8_4_ = local_7e0._8_4_ * fVar241;
                      auVar183._12_4_ = local_7e0._12_4_ * fVar241;
                      auVar86 = vfmadd213ps_fma(auVar245,auVar183,auVar6);
                      auVar88 = vshufps_avx(auVar183,auVar183,0xc9);
                      auVar245 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar184._0_4_ = auVar183._0_4_ * auVar245._0_4_;
                      auVar184._4_4_ = auVar183._4_4_ * auVar245._4_4_;
                      auVar184._8_4_ = auVar183._8_4_ * auVar245._8_4_;
                      auVar184._12_4_ = auVar183._12_4_ * auVar245._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar184,auVar6,auVar88);
                      auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar245 = vshufps_avx(auVar86,auVar86,0xc9);
                      auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                      auVar155._0_4_ = auVar86._0_4_ * auVar89._0_4_;
                      auVar155._4_4_ = auVar86._4_4_ * auVar89._4_4_;
                      auVar155._8_4_ = auVar86._8_4_ * auVar89._8_4_;
                      auVar155._12_4_ = auVar86._12_4_ * auVar89._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar155,auVar88,auVar245);
                      uVar147 = auVar88._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        uVar9 = vextractps_avx(auVar88,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar9;
                        uVar9 = vextractps_avx(auVar88,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar147;
                        *(float *)(ray + k * 4 + 0xf0) = fVar244;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar5;
                        *(uint *)(ray + k * 4 + 0x120) = uVar81;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_600 = (RTCHitN  [16])vshufps_avx(auVar88,auVar88,0x55);
                        auStack_5f0 = vshufps_avx(auVar88,auVar88,0xaa);
                        local_5e0 = uVar147;
                        uStack_5dc = uVar147;
                        uStack_5d8 = uVar147;
                        uStack_5d4 = uVar147;
                        local_5d0 = fVar244;
                        fStack_5cc = fVar244;
                        fStack_5c8 = fVar244;
                        fStack_5c4 = fVar244;
                        local_5c0 = ZEXT416(0) << 0x20;
                        local_5b0 = local_620._0_8_;
                        uStack_5a8 = local_620._8_8_;
                        local_5a0 = local_610;
                        vpcmpeqd_avx2(ZEXT1632(local_610),ZEXT1632(local_610));
                        uStack_58c = context->user->instID[0];
                        local_590 = uStack_58c;
                        uStack_588 = uStack_58c;
                        uStack_584 = uStack_58c;
                        uStack_580 = context->user->instPrimID[0];
                        uStack_57c = uStack_580;
                        uStack_578 = uStack_580;
                        uStack_574 = uStack_580;
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        local_900 = local_630._0_8_;
                        uStack_8f8 = local_630._8_8_;
                        local_8d0.valid = (int *)&local_900;
                        local_8d0.geometryUserPtr = pGVar10->userPtr;
                        local_8d0.context = context->user;
                        local_8d0.hit = local_600;
                        local_8d0.N = 4;
                        local_8d0.ray = (RTCRayN *)ray;
                        if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar228 = ZEXT464((uint)fVar207);
                          auVar239 = ZEXT1664(auVar238);
                          auVar251 = ZEXT1664(auVar153);
                          auVar255 = ZEXT1664(auVar6);
                          (*pGVar10->intersectionFilterN)(&local_8d0);
                          auVar240 = ZEXT1664(ZEXT416((uint)fVar233));
                          auVar246 = ZEXT1664(ZEXT416((uint)fVar244));
                          auVar257 = ZEXT3264(local_840);
                          auVar258 = ZEXT3264(local_820);
                        }
                        auVar63._8_8_ = uStack_8f8;
                        auVar63._0_8_ = local_900;
                        uVar84 = vptestmd_avx512vl(auVar63,auVar63);
                        if ((uVar84 & 0xf) != 0) {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar228 = ZEXT1664(auVar228._0_16_);
                            auVar239 = ZEXT1664(auVar239._0_16_);
                            auVar251 = ZEXT1664(auVar251._0_16_);
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            (*p_Var11)(&local_8d0);
                            auVar240 = ZEXT1664(ZEXT416((uint)fVar233));
                            auVar246 = ZEXT1664(ZEXT416((uint)fVar244));
                            auVar257 = ZEXT3264(local_840);
                            auVar258 = ZEXT3264(local_820);
                          }
                          auVar64._8_8_ = uStack_8f8;
                          auVar64._0_8_ = local_900;
                          uVar84 = vptestmd_avx512vl(auVar64,auVar64);
                          uVar84 = uVar84 & 0xf;
                          bVar76 = (byte)uVar84;
                          if (bVar76 != 0) {
                            iVar3 = *(int *)(local_8d0.hit + 4);
                            iVar4 = *(int *)(local_8d0.hit + 8);
                            iVar1 = *(int *)(local_8d0.hit + 0xc);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xc0) =
                                 (uint)(bVar76 & 1) * *(int *)local_8d0.hit |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_8d0.ray + 0xc0);
                            *(uint *)(local_8d0.ray + 0xc4) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0xc4);
                            *(uint *)(local_8d0.ray + 200) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 200);
                            *(uint *)(local_8d0.ray + 0xcc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0xcc);
                            iVar3 = *(int *)(local_8d0.hit + 0x14);
                            iVar4 = *(int *)(local_8d0.hit + 0x18);
                            iVar1 = *(int *)(local_8d0.hit + 0x1c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xd0) =
                                 (uint)(bVar76 & 1) * *(int *)(local_8d0.hit + 0x10) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_8d0.ray + 0xd0);
                            *(uint *)(local_8d0.ray + 0xd4) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0xd4);
                            *(uint *)(local_8d0.ray + 0xd8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xd8);
                            *(uint *)(local_8d0.ray + 0xdc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0xdc);
                            iVar3 = *(int *)(local_8d0.hit + 0x24);
                            iVar4 = *(int *)(local_8d0.hit + 0x28);
                            iVar1 = *(int *)(local_8d0.hit + 0x2c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xe0) =
                                 (uint)(bVar76 & 1) * *(int *)(local_8d0.hit + 0x20) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_8d0.ray + 0xe0);
                            *(uint *)(local_8d0.ray + 0xe4) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0xe4);
                            *(uint *)(local_8d0.ray + 0xe8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xe8);
                            *(uint *)(local_8d0.ray + 0xec) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0xec);
                            iVar3 = *(int *)(local_8d0.hit + 0x34);
                            iVar4 = *(int *)(local_8d0.hit + 0x38);
                            iVar1 = *(int *)(local_8d0.hit + 0x3c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0xf0) =
                                 (uint)(bVar76 & 1) * *(int *)(local_8d0.hit + 0x30) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_8d0.ray + 0xf0);
                            *(uint *)(local_8d0.ray + 0xf4) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0xf4);
                            *(uint *)(local_8d0.ray + 0xf8) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0xf8);
                            *(uint *)(local_8d0.ray + 0xfc) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0xfc);
                            iVar3 = *(int *)(local_8d0.hit + 0x44);
                            iVar4 = *(int *)(local_8d0.hit + 0x48);
                            iVar1 = *(int *)(local_8d0.hit + 0x4c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar14 = SUB81(uVar84 >> 3,0);
                            *(uint *)(local_8d0.ray + 0x100) =
                                 (uint)(bVar76 & 1) * *(int *)(local_8d0.hit + 0x40) |
                                 (uint)!(bool)(bVar76 & 1) * *(int *)(local_8d0.ray + 0x100);
                            *(uint *)(local_8d0.ray + 0x104) =
                                 (uint)bVar83 * iVar3 |
                                 (uint)!bVar83 * *(int *)(local_8d0.ray + 0x104);
                            *(uint *)(local_8d0.ray + 0x108) =
                                 (uint)bVar13 * iVar4 |
                                 (uint)!bVar13 * *(int *)(local_8d0.ray + 0x108);
                            *(uint *)(local_8d0.ray + 0x10c) =
                                 (uint)bVar14 * iVar1 |
                                 (uint)!bVar14 * *(int *)(local_8d0.ray + 0x10c);
                            auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x50));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x110) = auVar88;
                            auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x60));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x120) = auVar88;
                            auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x70));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x130) = auVar88;
                            auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_8d0.hit + 0x80));
                            *(undefined1 (*) [16])(local_8d0.ray + 0x140) = auVar88;
                            goto LAB_01d3f65c;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar234;
                      }
                    }
                  }
                }
LAB_01d3f65c:
                bVar83 = lVar82 != 0;
                lVar82 = lVar82 + -1;
              } while ((!bVar12) && (bVar83));
              auVar68._4_4_ = fStack_53c;
              auVar68._0_4_ = local_540;
              auVar68._8_4_ = fStack_538;
              auVar68._12_4_ = fStack_534;
              auVar68._16_4_ = fStack_530;
              auVar68._20_4_ = fStack_52c;
              auVar68._24_4_ = fStack_528;
              auVar68._28_4_ = fStack_524;
              uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar34._4_4_ = uVar147;
              auVar34._0_4_ = uVar147;
              auVar34._8_4_ = uVar147;
              auVar34._12_4_ = uVar147;
              auVar34._16_4_ = uVar147;
              auVar34._20_4_ = uVar147;
              auVar34._24_4_ = uVar147;
              auVar34._28_4_ = uVar147;
              uVar19 = vcmpps_avx512vl(auVar68,auVar34,2);
              bVar79 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar79 & (byte)uVar19;
            } while (bVar79 != 0);
          }
          uVar20 = vpcmpd_avx512vl(local_4e0,_local_560,1);
          uVar21 = vpcmpd_avx512vl(local_4e0,local_440,1);
          auVar185._0_4_ = (float)local_680._0_4_ + (float)local_1c0._0_4_;
          auVar185._4_4_ = (float)local_680._4_4_ + (float)local_1c0._4_4_;
          auVar185._8_4_ = fStack_678 + fStack_1b8;
          auVar185._12_4_ = fStack_674 + fStack_1b4;
          auVar185._16_4_ = fStack_670 + fStack_1b0;
          auVar185._20_4_ = fStack_66c + fStack_1ac;
          auVar185._24_4_ = fStack_668 + fStack_1a8;
          auVar185._28_4_ = fStack_664 + fStack_1a4;
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar202._4_4_ = uVar147;
          auVar202._0_4_ = uVar147;
          auVar202._8_4_ = uVar147;
          auVar202._12_4_ = uVar147;
          auVar202._16_4_ = uVar147;
          auVar202._20_4_ = uVar147;
          auVar202._24_4_ = uVar147;
          auVar202._28_4_ = uVar147;
          uVar19 = vcmpps_avx512vl(auVar185,auVar202,2);
          bVar79 = (byte)local_8e0 & (byte)uVar21 & (byte)uVar19;
          auVar216._0_4_ = (float)local_680._0_4_ + (float)local_480._0_4_;
          auVar216._4_4_ = (float)local_680._4_4_ + (float)local_480._4_4_;
          auVar216._8_4_ = fStack_678 + fStack_478;
          auVar216._12_4_ = fStack_674 + fStack_474;
          auVar216._16_4_ = fStack_670 + fStack_470;
          auVar216._20_4_ = fStack_66c + fStack_46c;
          auVar216._24_4_ = fStack_668 + fStack_468;
          auVar216._28_4_ = fStack_664 + fStack_464;
          uVar19 = vcmpps_avx512vl(auVar216,auVar202,2);
          bVar74 = bVar74 & (byte)uVar20 & (byte)uVar19 | bVar79;
          prim = local_860;
          pPVar80 = local_868;
          if (bVar74 == 0) {
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar256 = ZEXT3264(auVar98);
          }
          else {
            uVar84 = local_850 & 0xffffffff;
            abStack_180[uVar84 * 0x60] = bVar74;
            bVar12 = (bool)(bVar79 >> 1 & 1);
            bVar83 = (bool)(bVar79 >> 2 & 1);
            bVar13 = (bool)(bVar79 >> 3 & 1);
            bVar14 = (bool)(bVar79 >> 4 & 1);
            bVar15 = (bool)(bVar79 >> 5 & 1);
            bVar16 = (bool)(bVar79 >> 6 & 1);
            auStack_160[uVar84 * 0x18] =
                 (uint)(bVar79 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar79 & 1) * local_480._0_4_;
            auStack_160[uVar84 * 0x18 + 1] =
                 (uint)bVar12 * local_1c0._4_4_ | (uint)!bVar12 * local_480._4_4_;
            auStack_160[uVar84 * 0x18 + 2] =
                 (uint)bVar83 * (int)fStack_1b8 | (uint)!bVar83 * (int)fStack_478;
            auStack_160[uVar84 * 0x18 + 3] =
                 (uint)bVar13 * (int)fStack_1b4 | (uint)!bVar13 * (int)fStack_474;
            auStack_160[uVar84 * 0x18 + 4] =
                 (uint)bVar14 * (int)fStack_1b0 | (uint)!bVar14 * (int)fStack_470;
            afStack_140[uVar84 * 0x18 + -3] =
                 (float)((uint)bVar15 * (int)fStack_1ac | (uint)!bVar15 * (int)fStack_46c);
            afStack_140[uVar84 * 0x18 + -2] =
                 (float)((uint)bVar16 * (int)fStack_1a8 | (uint)!bVar16 * (int)fStack_468);
            afStack_140[uVar84 * 0x18 + -1] =
                 (float)((uint)(bVar79 >> 7) * (int)fStack_1a4 |
                        (uint)!(bool)(bVar79 >> 7) * (int)fStack_464);
            uVar19 = vmovlps_avx(local_880);
            *(undefined8 *)(afStack_140 + uVar84 * 0x18) = uVar19;
            auStack_138[uVar84 * 0x18] = (int)local_858 + 1;
            local_850 = (ulong)((int)local_850 + 1);
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar256 = ZEXT3264(auVar98);
          }
        }
      }
    }
    auVar203 = ZEXT1664(local_880);
    local_850 = local_850 & 0xffffffff;
    do {
      if ((int)local_850 == 0) {
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar36._4_4_ = uVar5;
        auVar36._0_4_ = uVar5;
        auVar36._8_4_ = uVar5;
        auVar36._12_4_ = uVar5;
        auVar36._16_4_ = uVar5;
        auVar36._20_4_ = uVar5;
        auVar36._24_4_ = uVar5;
        auVar36._28_4_ = uVar5;
        uVar19 = vcmpps_avx512vl(local_420,auVar36,2);
        uVar81 = (uint)local_848 & (uint)uVar19;
        local_848 = (ulong)uVar81;
        if (uVar81 == 0) {
          return;
        }
        goto LAB_01d3d394;
      }
      uVar84 = (ulong)((int)local_850 - 1);
      auVar98 = *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x18);
      auVar186._0_4_ = auVar98._0_4_ + (float)local_680._0_4_;
      auVar186._4_4_ = auVar98._4_4_ + (float)local_680._4_4_;
      auVar186._8_4_ = auVar98._8_4_ + fStack_678;
      auVar186._12_4_ = auVar98._12_4_ + fStack_674;
      auVar186._16_4_ = auVar98._16_4_ + fStack_670;
      auVar186._20_4_ = auVar98._20_4_ + fStack_66c;
      auVar186._24_4_ = auVar98._24_4_ + fStack_668;
      auVar186._28_4_ = auVar98._28_4_ + fStack_664;
      uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar35._4_4_ = uVar147;
      auVar35._0_4_ = uVar147;
      auVar35._8_4_ = uVar147;
      auVar35._12_4_ = uVar147;
      auVar35._16_4_ = uVar147;
      auVar35._20_4_ = uVar147;
      auVar35._24_4_ = uVar147;
      auVar35._28_4_ = uVar147;
      uVar19 = vcmpps_avx512vl(auVar186,auVar35,2);
      uVar85 = (uint)uVar19 & (uint)abStack_180[uVar84 * 0x60];
      bVar74 = (byte)uVar85;
      if (uVar85 != 0) {
        auVar187._8_4_ = 0x7f800000;
        auVar187._0_8_ = 0x7f8000007f800000;
        auVar187._12_4_ = 0x7f800000;
        auVar187._16_4_ = 0x7f800000;
        auVar187._20_4_ = 0x7f800000;
        auVar187._24_4_ = 0x7f800000;
        auVar187._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar187,auVar98);
        auVar137._0_4_ =
             (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar98._0_4_;
        bVar12 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * (int)auVar98._4_4_;
        bVar12 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * (int)auVar98._8_4_;
        bVar12 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * (int)auVar98._12_4_;
        bVar12 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar137._16_4_ = (uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * (int)auVar98._16_4_;
        bVar12 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar137._20_4_ = (uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * (int)auVar98._20_4_;
        bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar137._24_4_ = (uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * (int)auVar98._24_4_;
        auVar137._28_4_ =
             (uVar85 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar85 >> 7,0) * (int)auVar98._28_4_;
        auVar98 = vshufps_avx(auVar137,auVar137,0xb1);
        auVar98 = vminps_avx(auVar137,auVar98);
        auVar96 = vshufpd_avx(auVar98,auVar98,5);
        auVar98 = vminps_avx(auVar98,auVar96);
        auVar96 = vpermpd_avx2(auVar98,0x4e);
        auVar98 = vminps_avx(auVar98,auVar96);
        uVar19 = vcmpps_avx512vl(auVar137,auVar98,0);
        bVar79 = (byte)uVar19 & bVar74;
        if (bVar79 != 0) {
          uVar85 = (uint)bVar79;
        }
        fVar145 = afStack_140[uVar84 * 0x18 + 1];
        uVar138 = 0;
        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
          uVar138 = uVar138 + 1;
        }
        local_858 = (ulong)auStack_138[uVar84 * 0x18];
        bVar79 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar74;
        abStack_180[uVar84 * 0x60] = bVar79;
        uVar77 = uVar84;
        if (bVar79 != 0) {
          uVar77 = local_850;
        }
        fVar232 = afStack_140[uVar84 * 0x18];
        auVar188._4_4_ = fVar232;
        auVar188._0_4_ = fVar232;
        auVar188._8_4_ = fVar232;
        auVar188._12_4_ = fVar232;
        auVar188._16_4_ = fVar232;
        auVar188._20_4_ = fVar232;
        auVar188._24_4_ = fVar232;
        auVar188._28_4_ = fVar232;
        fVar145 = fVar145 - fVar232;
        auVar164._4_4_ = fVar145;
        auVar164._0_4_ = fVar145;
        auVar164._8_4_ = fVar145;
        auVar164._12_4_ = fVar145;
        auVar164._16_4_ = fVar145;
        auVar164._20_4_ = fVar145;
        auVar164._24_4_ = fVar145;
        auVar164._28_4_ = fVar145;
        auVar88 = vfmadd132ps_fma(auVar164,auVar188,_DAT_02020f20);
        _local_600 = ZEXT1632(auVar88);
        auVar203 = ZEXT864(*(ulong *)(local_600 + (ulong)uVar138 * 4));
        uVar84 = uVar77;
      }
      local_850 = uVar84;
    } while (bVar74 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }